

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCRayQueryContext *pRVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  uint uVar87;
  uint uVar88;
  uint uVar89;
  ulong uVar90;
  undefined1 (*pauVar91) [32];
  uint uVar92;
  uint uVar93;
  int iVar94;
  ulong uVar95;
  long lVar96;
  long lVar97;
  float fVar98;
  float fVar124;
  float fVar125;
  vint4 bi_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar126;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar108 [16];
  undefined1 auVar123 [32];
  float fVar127;
  float fVar153;
  float fVar156;
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar164;
  float fVar187;
  float fVar188;
  vint4 bi_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar171 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar194;
  float fVar215;
  float fVar216;
  vint4 ai_1;
  undefined1 auVar195 [16];
  float fVar217;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [28];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar218;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar219;
  float fVar237;
  float fVar238;
  vint4 ai_2;
  undefined1 auVar220 [16];
  float fVar239;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar242;
  float fVar243;
  undefined1 auVar231 [28];
  float fVar240;
  float fVar241;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar244;
  float fVar245;
  float fVar253;
  float fVar255;
  undefined1 auVar246 [16];
  float fVar257;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar262;
  float fVar272;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar276;
  float fVar278;
  undefined1 auVar266 [32];
  float fVar274;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar275;
  float fVar277;
  float fVar279;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar280;
  float fVar293;
  float fVar294;
  vint4 ai;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar296;
  float fVar298;
  float fVar300;
  float fVar302;
  float fVar304;
  undefined1 auVar287 [32];
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar314 [64];
  float s;
  float fVar315;
  float fVar316;
  float fVar319;
  float fVar321;
  undefined1 auVar317 [16];
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar318 [32];
  float fVar335;
  float fVar342;
  float fVar343;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar354;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  float fVar355;
  float fVar361;
  float fVar364;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar356;
  float fVar357;
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar360 [32];
  float fVar377;
  float fVar387;
  float fVar390;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  float fVar378;
  float fVar379;
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar405 [16];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_cc4;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined4 uStack_c68;
  undefined4 uStack_c64;
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 (*local_a78) [16];
  undefined1 (*local_a70) [16];
  uint *local_a68;
  undefined1 local_a60 [8];
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  ulong local_940;
  undefined1 auStack_938 [24];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  Primitive *local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  RTCHitN local_680 [16];
  undefined1 auStack_670 [16];
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  uint local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  uint local_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar313 [64];
  
  PVar10 = prim[1];
  uVar95 = (ulong)(byte)PVar10;
  lVar97 = uVar95 * 0x25;
  fVar127 = *(float *)(prim + lVar97 + 0x12);
  auVar134 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar134 = vinsertps_avx(auVar134,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar134 = vsubps_avx(auVar134,*(undefined1 (*) [16])(prim + lVar97 + 6));
  auVar130._0_4_ = fVar127 * auVar134._0_4_;
  auVar130._4_4_ = fVar127 * auVar134._4_4_;
  auVar130._8_4_ = fVar127 * auVar134._8_4_;
  auVar130._12_4_ = fVar127 * auVar134._12_4_;
  auVar281._0_4_ = fVar127 * auVar17._0_4_;
  auVar281._4_4_ = fVar127 * auVar17._4_4_;
  auVar281._8_4_ = fVar127 * auVar17._8_4_;
  auVar281._12_4_ = fVar127 * auVar17._12_4_;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xf + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar95 + 6)));
  auVar206 = vcvtdq2ps_avx(auVar206);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0x1a + 6)));
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0x1b + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar350 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0x1c + 6)));
  auVar350 = vcvtdq2ps_avx(auVar350);
  auVar174 = vshufps_avx(auVar281,auVar281,0);
  auVar139 = vshufps_avx(auVar281,auVar281,0x55);
  auVar30 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar127 = auVar30._0_4_;
  fVar129 = auVar30._4_4_;
  fVar154 = auVar30._8_4_;
  fVar157 = auVar30._12_4_;
  fVar219 = auVar139._0_4_;
  fVar237 = auVar139._4_4_;
  fVar238 = auVar139._8_4_;
  fVar239 = auVar139._12_4_;
  fVar194 = auVar174._0_4_;
  fVar215 = auVar174._4_4_;
  fVar216 = auVar174._8_4_;
  fVar217 = auVar174._12_4_;
  auVar358._0_4_ = fVar194 * auVar134._0_4_ + fVar219 * auVar17._0_4_ + fVar127 * auVar28._0_4_;
  auVar358._4_4_ = fVar215 * auVar134._4_4_ + fVar237 * auVar17._4_4_ + fVar129 * auVar28._4_4_;
  auVar358._8_4_ = fVar216 * auVar134._8_4_ + fVar238 * auVar17._8_4_ + fVar154 * auVar28._8_4_;
  auVar358._12_4_ = fVar217 * auVar134._12_4_ + fVar239 * auVar17._12_4_ + fVar157 * auVar28._12_4_;
  auVar380._0_4_ = fVar194 * auVar29._0_4_ + fVar219 * auVar206._0_4_ + auVar168._0_4_ * fVar127;
  auVar380._4_4_ = fVar215 * auVar29._4_4_ + fVar237 * auVar206._4_4_ + auVar168._4_4_ * fVar129;
  auVar380._8_4_ = fVar216 * auVar29._8_4_ + fVar238 * auVar206._8_4_ + auVar168._8_4_ * fVar154;
  auVar380._12_4_ = fVar217 * auVar29._12_4_ + fVar239 * auVar206._12_4_ + auVar168._12_4_ * fVar157
  ;
  auVar282._0_4_ = fVar194 * auVar172._0_4_ + fVar219 * auVar105._0_4_ + auVar350._0_4_ * fVar127;
  auVar282._4_4_ = fVar215 * auVar172._4_4_ + fVar237 * auVar105._4_4_ + auVar350._4_4_ * fVar129;
  auVar282._8_4_ = fVar216 * auVar172._8_4_ + fVar238 * auVar105._8_4_ + auVar350._8_4_ * fVar154;
  auVar282._12_4_ =
       fVar217 * auVar172._12_4_ + fVar239 * auVar105._12_4_ + auVar350._12_4_ * fVar157;
  auVar174 = vshufps_avx(auVar130,auVar130,0);
  auVar139 = vshufps_avx(auVar130,auVar130,0x55);
  auVar30 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar127 = auVar30._0_4_;
  fVar129 = auVar30._4_4_;
  fVar154 = auVar30._8_4_;
  fVar157 = auVar30._12_4_;
  fVar219 = auVar139._0_4_;
  fVar237 = auVar139._4_4_;
  fVar238 = auVar139._8_4_;
  fVar239 = auVar139._12_4_;
  fVar194 = auVar174._0_4_;
  fVar215 = auVar174._4_4_;
  fVar216 = auVar174._8_4_;
  fVar217 = auVar174._12_4_;
  auVar131._0_4_ = fVar194 * auVar134._0_4_ + fVar219 * auVar17._0_4_ + fVar127 * auVar28._0_4_;
  auVar131._4_4_ = fVar215 * auVar134._4_4_ + fVar237 * auVar17._4_4_ + fVar129 * auVar28._4_4_;
  auVar131._8_4_ = fVar216 * auVar134._8_4_ + fVar238 * auVar17._8_4_ + fVar154 * auVar28._8_4_;
  auVar131._12_4_ = fVar217 * auVar134._12_4_ + fVar239 * auVar17._12_4_ + fVar157 * auVar28._12_4_;
  auVar99._0_4_ = fVar194 * auVar29._0_4_ + auVar168._0_4_ * fVar127 + fVar219 * auVar206._0_4_;
  auVar99._4_4_ = fVar215 * auVar29._4_4_ + auVar168._4_4_ * fVar129 + fVar237 * auVar206._4_4_;
  auVar99._8_4_ = fVar216 * auVar29._8_4_ + auVar168._8_4_ * fVar154 + fVar238 * auVar206._8_4_;
  auVar99._12_4_ = fVar217 * auVar29._12_4_ + auVar168._12_4_ * fVar157 + fVar239 * auVar206._12_4_;
  auVar305._8_4_ = 0x7fffffff;
  auVar305._0_8_ = 0x7fffffff7fffffff;
  auVar305._12_4_ = 0x7fffffff;
  auVar134 = vandps_avx(auVar358,auVar305);
  auVar220._8_4_ = 0x219392ef;
  auVar220._0_8_ = 0x219392ef219392ef;
  auVar220._12_4_ = 0x219392ef;
  auVar134 = vcmpps_avx(auVar134,auVar220,1);
  auVar17 = vblendvps_avx(auVar358,auVar220,auVar134);
  auVar134 = vandps_avx(auVar380,auVar305);
  auVar134 = vcmpps_avx(auVar134,auVar220,1);
  auVar28 = vblendvps_avx(auVar380,auVar220,auVar134);
  auVar134 = vandps_avx(auVar305,auVar282);
  auVar134 = vcmpps_avx(auVar134,auVar220,1);
  auVar134 = vblendvps_avx(auVar282,auVar220,auVar134);
  auVar165._0_4_ = fVar194 * auVar172._0_4_ + fVar219 * auVar105._0_4_ + auVar350._0_4_ * fVar127;
  auVar165._4_4_ = fVar215 * auVar172._4_4_ + fVar237 * auVar105._4_4_ + auVar350._4_4_ * fVar129;
  auVar165._8_4_ = fVar216 * auVar172._8_4_ + fVar238 * auVar105._8_4_ + auVar350._8_4_ * fVar154;
  auVar165._12_4_ =
       fVar217 * auVar172._12_4_ + fVar239 * auVar105._12_4_ + auVar350._12_4_ * fVar157;
  auVar29 = vrcpps_avx(auVar17);
  fVar194 = auVar29._0_4_;
  auVar195._0_4_ = fVar194 * auVar17._0_4_;
  fVar215 = auVar29._4_4_;
  auVar195._4_4_ = fVar215 * auVar17._4_4_;
  fVar216 = auVar29._8_4_;
  auVar195._8_4_ = fVar216 * auVar17._8_4_;
  fVar217 = auVar29._12_4_;
  auVar195._12_4_ = fVar217 * auVar17._12_4_;
  auVar263._8_4_ = 0x3f800000;
  auVar263._0_8_ = 0x3f8000003f800000;
  auVar263._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar263,auVar195);
  fVar194 = fVar194 + fVar194 * auVar17._0_4_;
  fVar215 = fVar215 + fVar215 * auVar17._4_4_;
  fVar216 = fVar216 + fVar216 * auVar17._8_4_;
  fVar217 = fVar217 + fVar217 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar28);
  fVar219 = auVar17._0_4_;
  auVar246._0_4_ = fVar219 * auVar28._0_4_;
  fVar237 = auVar17._4_4_;
  auVar246._4_4_ = fVar237 * auVar28._4_4_;
  fVar238 = auVar17._8_4_;
  auVar246._8_4_ = fVar238 * auVar28._8_4_;
  fVar239 = auVar17._12_4_;
  auVar246._12_4_ = fVar239 * auVar28._12_4_;
  auVar17 = vsubps_avx(auVar263,auVar246);
  fVar219 = fVar219 + fVar219 * auVar17._0_4_;
  fVar237 = fVar237 + fVar237 * auVar17._4_4_;
  fVar238 = fVar238 + fVar238 * auVar17._8_4_;
  fVar239 = fVar239 + fVar239 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar134);
  fVar244 = auVar17._0_4_;
  auVar283._0_4_ = fVar244 * auVar134._0_4_;
  fVar253 = auVar17._4_4_;
  auVar283._4_4_ = fVar253 * auVar134._4_4_;
  fVar255 = auVar17._8_4_;
  auVar283._8_4_ = fVar255 * auVar134._8_4_;
  fVar257 = auVar17._12_4_;
  auVar283._12_4_ = fVar257 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar263,auVar283);
  fVar244 = fVar244 + fVar244 * auVar134._0_4_;
  fVar253 = fVar253 + fVar253 * auVar134._4_4_;
  fVar255 = fVar255 + fVar255 * auVar134._8_4_;
  fVar257 = fVar257 + fVar257 * auVar134._12_4_;
  auVar134 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar97 + 0x16)) *
                           *(float *)(prim + lVar97 + 0x1a)));
  auVar28 = vshufps_avx(auVar134,auVar134,0);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar134 = vpmovsxwd_avx(auVar134);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar95 * 0xb + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar29 = vsubps_avx(auVar17,auVar134);
  fVar127 = auVar28._0_4_;
  fVar129 = auVar28._4_4_;
  fVar154 = auVar28._8_4_;
  fVar157 = auVar28._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar95 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar28);
  auVar284._0_4_ = auVar29._0_4_ * fVar127 + auVar134._0_4_;
  auVar284._4_4_ = auVar29._4_4_ * fVar129 + auVar134._4_4_;
  auVar284._8_4_ = auVar29._8_4_ * fVar154 + auVar134._8_4_;
  auVar284._12_4_ = auVar29._12_4_ * fVar157 + auVar134._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar95 * 0xd + 6);
  auVar28 = vpmovsxwd_avx(auVar29);
  auVar134 = vcvtdq2ps_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar28);
  auVar17 = vsubps_avx(auVar17,auVar134);
  auVar306._0_4_ = auVar17._0_4_ * fVar127 + auVar134._0_4_;
  auVar306._4_4_ = auVar17._4_4_ * fVar129 + auVar134._4_4_;
  auVar306._8_4_ = auVar17._8_4_ * fVar154 + auVar134._8_4_;
  auVar306._12_4_ = auVar17._12_4_ * fVar157 + auVar134._12_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar95 * 0x12 + 6);
  auVar134 = vpmovsxwd_avx(auVar206);
  uVar90 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar95 * 2 + uVar90 + 6);
  auVar17 = vpmovsxwd_avx(auVar168);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar134);
  auVar317._0_4_ = auVar17._0_4_ * fVar127 + auVar134._0_4_;
  auVar317._4_4_ = auVar17._4_4_ * fVar129 + auVar134._4_4_;
  auVar317._8_4_ = auVar17._8_4_ * fVar154 + auVar134._8_4_;
  auVar317._12_4_ = auVar17._12_4_ * fVar157 + auVar134._12_4_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar134 = vpmovsxwd_avx(auVar172);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar95 * 0x18 + 6);
  auVar17 = vpmovsxwd_avx(auVar105);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar28 = vsubps_avx(auVar17,auVar134);
  auVar350._8_8_ = 0;
  auVar350._0_8_ = *(ulong *)(prim + uVar95 * 0x1d + 6);
  auVar17 = vpmovsxwd_avx(auVar350);
  auVar336._0_4_ = auVar28._0_4_ * fVar127 + auVar134._0_4_;
  auVar336._4_4_ = auVar28._4_4_ * fVar129 + auVar134._4_4_;
  auVar336._8_4_ = auVar28._8_4_ * fVar154 + auVar134._8_4_;
  auVar336._12_4_ = auVar28._12_4_ * fVar157 + auVar134._12_4_;
  auVar134 = vcvtdq2ps_avx(auVar17);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar95 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar17 = vpmovsxwd_avx(auVar174);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar134);
  auVar349._0_4_ = auVar17._0_4_ * fVar127 + auVar134._0_4_;
  auVar349._4_4_ = auVar17._4_4_ * fVar129 + auVar134._4_4_;
  auVar349._8_4_ = auVar17._8_4_ * fVar154 + auVar134._8_4_;
  auVar349._12_4_ = auVar17._12_4_ * fVar157 + auVar134._12_4_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar95) + 6);
  auVar134 = vpmovsxwd_avx(auVar139);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar95 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar30);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar134);
  auVar264._0_4_ = auVar134._0_4_ + auVar17._0_4_ * fVar127;
  auVar264._4_4_ = auVar134._4_4_ + auVar17._4_4_ * fVar129;
  auVar264._8_4_ = auVar134._8_4_ + auVar17._8_4_ * fVar154;
  auVar264._12_4_ = auVar134._12_4_ + auVar17._12_4_ * fVar157;
  auVar134 = vsubps_avx(auVar284,auVar131);
  auVar285._0_4_ = fVar194 * auVar134._0_4_;
  auVar285._4_4_ = fVar215 * auVar134._4_4_;
  auVar285._8_4_ = fVar216 * auVar134._8_4_;
  auVar285._12_4_ = fVar217 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar306,auVar131);
  auVar132._0_4_ = fVar194 * auVar134._0_4_;
  auVar132._4_4_ = fVar215 * auVar134._4_4_;
  auVar132._8_4_ = fVar216 * auVar134._8_4_;
  auVar132._12_4_ = fVar217 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar317,auVar99);
  auVar196._0_4_ = fVar219 * auVar134._0_4_;
  auVar196._4_4_ = fVar237 * auVar134._4_4_;
  auVar196._8_4_ = fVar238 * auVar134._8_4_;
  auVar196._12_4_ = fVar239 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar336,auVar99);
  auVar100._0_4_ = fVar219 * auVar134._0_4_;
  auVar100._4_4_ = fVar237 * auVar134._4_4_;
  auVar100._8_4_ = fVar238 * auVar134._8_4_;
  auVar100._12_4_ = fVar239 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar349,auVar165);
  auVar221._0_4_ = fVar244 * auVar134._0_4_;
  auVar221._4_4_ = fVar253 * auVar134._4_4_;
  auVar221._8_4_ = fVar255 * auVar134._8_4_;
  auVar221._12_4_ = fVar257 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar264,auVar165);
  auVar166._0_4_ = fVar244 * auVar134._0_4_;
  auVar166._4_4_ = fVar253 * auVar134._4_4_;
  auVar166._8_4_ = fVar255 * auVar134._8_4_;
  auVar166._12_4_ = fVar257 * auVar134._12_4_;
  auVar134 = vpminsd_avx(auVar285,auVar132);
  auVar17 = vpminsd_avx(auVar196,auVar100);
  auVar134 = vmaxps_avx(auVar134,auVar17);
  auVar17 = vpminsd_avx(auVar221,auVar166);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar307._4_4_ = uVar8;
  auVar307._0_4_ = uVar8;
  auVar307._8_4_ = uVar8;
  auVar307._12_4_ = uVar8;
  auVar17 = vmaxps_avx(auVar17,auVar307);
  auVar134 = vmaxps_avx(auVar134,auVar17);
  local_6a0._0_4_ = auVar134._0_4_ * 0.99999964;
  local_6a0._4_4_ = auVar134._4_4_ * 0.99999964;
  local_6a0._8_4_ = auVar134._8_4_ * 0.99999964;
  local_6a0._12_4_ = auVar134._12_4_ * 0.99999964;
  auVar134 = vpmaxsd_avx(auVar285,auVar132);
  auVar17 = vpmaxsd_avx(auVar196,auVar100);
  auVar134 = vminps_avx(auVar134,auVar17);
  auVar17 = vpmaxsd_avx(auVar221,auVar166);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar167._4_4_ = uVar8;
  auVar167._0_4_ = uVar8;
  auVar167._8_4_ = uVar8;
  auVar167._12_4_ = uVar8;
  auVar17 = vminps_avx(auVar17,auVar167);
  auVar134 = vminps_avx(auVar134,auVar17);
  auVar107._0_4_ = auVar134._0_4_ * 1.0000004;
  auVar107._4_4_ = auVar134._4_4_ * 1.0000004;
  auVar107._8_4_ = auVar134._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar134._12_4_ * 1.0000004;
  auVar134 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar17 = vpcmpgtd_avx(auVar134,_DAT_01f7fcf0);
  auVar134 = vcmpps_avx(local_6a0,auVar107,2);
  auVar134 = vandps_avx(auVar134,auVar17);
  uVar87 = vmovmskps_avx(auVar134);
  if (uVar87 == 0) {
    return;
  }
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  uVar87 = uVar87 & 0xff;
  local_4c0 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  uVar88 = 1 << ((byte)k & 0x1f);
  local_a68 = &local_5a0;
  local_a70 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar88 & 0xf) << 4));
  local_a78 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar88 >> 4) * 0x10);
  local_8e8 = prim;
LAB_00f9be02:
  lVar97 = 0;
  if (uVar87 != 0) {
    for (; (uVar87 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
    }
  }
  uVar88 = *(uint *)(local_8e8 + 2);
  local_940 = (ulong)*(uint *)(local_8e8 + lVar97 * 4 + 6);
  pGVar11 = (context->scene->geometries).items[uVar88].ptr;
  uVar95 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           local_940 *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar127 = (pGVar11->time_range).lower;
  fVar127 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar127) / ((pGVar11->time_range).upper - fVar127));
  auVar134 = vroundss_avx(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),9);
  auVar134 = vminss_avx(auVar134,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar134 = vmaxss_avx(ZEXT816(0) << 0x20,auVar134);
  fVar127 = fVar127 - auVar134._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar96 = (long)(int)auVar134._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + lVar96);
  lVar14 = *(long *)(_Var12 + 0x10 + lVar96);
  auVar134 = vshufps_avx(ZEXT416((uint)(1.0 - fVar127)),ZEXT416((uint)(1.0 - fVar127)),0);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar95);
  fVar194 = auVar134._0_4_;
  fVar215 = auVar134._4_4_;
  fVar216 = auVar134._8_4_;
  fVar217 = auVar134._12_4_;
  pfVar2 = (float *)(lVar13 + lVar14 * (uVar95 + 1));
  pfVar3 = (float *)(lVar13 + lVar14 * (uVar95 + 2));
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar95 + 3));
  lVar13 = *(long *)(_Var12 + 0x38 + lVar96);
  lVar14 = *(long *)(_Var12 + 0x48 + lVar96);
  auVar134 = vshufps_avx(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),0);
  pfVar5 = (float *)(lVar13 + uVar95 * lVar14);
  fVar219 = auVar134._0_4_;
  fVar237 = auVar134._4_4_;
  fVar238 = auVar134._8_4_;
  fVar239 = auVar134._12_4_;
  pfVar6 = (float *)(lVar13 + (uVar95 + 1) * lVar14);
  pfVar7 = (float *)(lVar13 + (uVar95 + 2) * lVar14);
  auVar308._0_4_ = fVar219 * *pfVar5 + fVar194 * *pfVar1;
  auVar308._4_4_ = fVar237 * pfVar5[1] + fVar215 * pfVar1[1];
  auVar308._8_4_ = fVar238 * pfVar5[2] + fVar216 * pfVar1[2];
  auVar308._12_4_ = fVar239 * pfVar5[3] + fVar217 * pfVar1[3];
  auVar313 = ZEXT1664(auVar308);
  auVar197._0_4_ = fVar194 * *pfVar2 + fVar219 * *pfVar6;
  auVar197._4_4_ = fVar215 * pfVar2[1] + fVar237 * pfVar6[1];
  auVar197._8_4_ = fVar216 * pfVar2[2] + fVar238 * pfVar6[2];
  auVar197._12_4_ = fVar217 * pfVar2[3] + fVar239 * pfVar6[3];
  auVar134 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar17 = vinsertps_avx(auVar134,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar127 = *(float *)(ray + k * 4 + 0x80);
  auVar359._4_4_ = fVar127;
  auVar359._0_4_ = fVar127;
  auVar359._8_4_ = fVar127;
  auVar359._12_4_ = fVar127;
  fStack_850 = fVar127;
  _local_860 = auVar359;
  fStack_84c = fVar127;
  fStack_848 = fVar127;
  fStack_844 = fVar127;
  fVar129 = *(float *)(ray + k * 4 + 0xa0);
  auVar381._4_4_ = fVar129;
  auVar381._0_4_ = fVar129;
  auVar381._8_4_ = fVar129;
  auVar381._12_4_ = fVar129;
  fStack_870 = fVar129;
  _local_880 = auVar381;
  fStack_86c = fVar129;
  fStack_868 = fVar129;
  fStack_864 = fVar129;
  auVar247._0_4_ = fVar194 * *pfVar3 + fVar219 * *pfVar7;
  auVar247._4_4_ = fVar215 * pfVar3[1] + fVar237 * pfVar7[1];
  auVar247._8_4_ = fVar216 * pfVar3[2] + fVar238 * pfVar7[2];
  auVar247._12_4_ = fVar217 * pfVar3[3] + fVar239 * pfVar7[3];
  auVar134 = vunpcklps_avx(auVar359,auVar381);
  fVar154 = *(float *)(ray + k * 4 + 0xc0);
  auVar405._4_4_ = fVar154;
  auVar405._0_4_ = fVar154;
  auVar405._8_4_ = fVar154;
  auVar405._12_4_ = fVar154;
  fStack_830 = fVar154;
  _local_840 = auVar405;
  fStack_82c = fVar154;
  fStack_828 = fVar154;
  fStack_824 = fVar154;
  _local_990 = vinsertps_avx(auVar134,auVar405,0x28);
  auVar101._0_4_ = (auVar308._0_4_ + auVar197._0_4_) * 0.5;
  auVar101._4_4_ = (auVar308._4_4_ + auVar197._4_4_) * 0.5;
  auVar101._8_4_ = (auVar308._8_4_ + auVar197._8_4_) * 0.5;
  auVar101._12_4_ = (auVar308._12_4_ + auVar197._12_4_) * 0.5;
  auVar134 = vsubps_avx(auVar101,auVar17);
  auVar134 = vdpps_avx(auVar134,_local_990,0x7f);
  local_9a0 = vdpps_avx(_local_990,_local_990,0x7f);
  auVar353 = ZEXT1664(local_9a0);
  auVar28 = vrcpss_avx(local_9a0,local_9a0);
  fVar157 = auVar134._0_4_ * auVar28._0_4_ * (2.0 - local_9a0._0_4_ * auVar28._0_4_);
  auVar28 = vshufps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),0);
  auVar222._0_4_ = auVar17._0_4_ + local_990._0_4_ * auVar28._0_4_;
  auVar222._4_4_ = auVar17._4_4_ + local_990._4_4_ * auVar28._4_4_;
  auVar222._8_4_ = auVar17._8_4_ + local_990._8_4_ * auVar28._8_4_;
  auVar222._12_4_ = auVar17._12_4_ + local_990._12_4_ * auVar28._12_4_;
  auVar134 = vblendps_avx(auVar222,_DAT_01f7aa10,8);
  _local_ae0 = vsubps_avx(auVar308,auVar134);
  pfVar1 = (float *)(lVar13 + lVar14 * (uVar95 + 3));
  _local_af0 = vsubps_avx(auVar247,auVar134);
  auVar133._0_4_ = fVar194 * *pfVar4 + fVar219 * *pfVar1;
  auVar133._4_4_ = fVar215 * pfVar4[1] + fVar237 * pfVar1[1];
  auVar133._8_4_ = fVar216 * pfVar4[2] + fVar238 * pfVar1[2];
  auVar133._12_4_ = fVar217 * pfVar4[3] + fVar239 * pfVar1[3];
  _local_b00 = vsubps_avx(auVar197,auVar134);
  _local_b10 = vsubps_avx(auVar133,auVar134);
  auVar134 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001250 = auVar134;
  _local_380 = auVar134;
  auVar134 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001250 = auVar134;
  _local_1e0 = auVar134;
  auVar134 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001250 = auVar134;
  _local_200 = auVar134;
  auVar134 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar134;
  _local_220 = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001290 = auVar134;
  _local_3a0 = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001290 = auVar134;
  _local_3c0 = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar134;
  _local_3e0 = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar134;
  _local_400 = auVar134;
  auVar134 = vshufps_avx(_local_af0,_local_af0,0);
  local_4a0._16_16_ = auVar134;
  local_4a0._0_16_ = auVar134;
  auVar134 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar134;
  _local_420 = auVar134;
  auVar134 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar134;
  _local_440 = auVar134;
  auVar134 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar134;
  _local_460 = auVar134;
  auVar17 = vshufps_avx(_local_b10,_local_b10,0);
  auVar29 = vshufps_avx(_local_b10,_local_b10,0x55);
  auVar134 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar134;
  _local_480 = auVar134;
  auVar134 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar134;
  _local_240 = auVar134;
  auVar134 = ZEXT416((uint)(fVar127 * fVar127 + fVar129 * fVar129 + fVar154 * fVar154));
  auVar134 = vshufps_avx(auVar134,auVar134,0);
  local_260._16_16_ = auVar134;
  local_260._0_16_ = auVar134;
  fVar127 = *(float *)(ray + k * 4 + 0x60);
  local_900 = ZEXT416((uint)fVar157);
  auVar134 = vshufps_avx(ZEXT416((uint)(fVar127 - fVar157)),ZEXT416((uint)(fVar127 - fVar157)),0);
  local_280._16_16_ = auVar134;
  local_280._0_16_ = auVar134;
  auVar134 = vpshufd_avx(ZEXT416(uVar88),0);
  local_500._16_16_ = auVar134;
  local_500._0_16_ = auVar134;
  auVar134 = vpshufd_avx(ZEXT416(*(uint *)(local_8e8 + lVar97 * 4 + 6)),0);
  local_520._16_16_ = auVar134;
  local_520._0_16_ = auVar134;
  register0x00001210 = auVar28;
  _local_920 = auVar28;
  uVar95 = 0;
  local_cc4 = 1;
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_260,auVar111);
  auVar134 = vsqrtss_avx(local_9a0,local_9a0);
  auVar28 = vsqrtss_avx(local_9a0,local_9a0);
  local_690 = ZEXT816(0x3f80000000000000);
  do {
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar232._16_4_ = 0x3f800000;
    auVar232._20_4_ = 0x3f800000;
    iVar94 = (int)uVar95;
    auVar232._24_4_ = 0x3f800000;
    auVar232._28_4_ = 0x3f800000;
    auVar206 = vmovshdup_avx(local_690);
    auVar172 = vsubps_avx(auVar206,local_690);
    auVar206 = vshufps_avx(local_690,local_690,0);
    local_a20._16_16_ = auVar206;
    local_a20._0_16_ = auVar206;
    auVar168 = vshufps_avx(auVar172,auVar172,0);
    local_800._16_16_ = auVar168;
    local_800._0_16_ = auVar168;
    fVar128 = auVar168._0_4_;
    fVar153 = auVar168._4_4_;
    fVar156 = auVar168._8_4_;
    fVar159 = auVar168._12_4_;
    fVar98 = auVar206._0_4_;
    auVar210._0_4_ = fVar98 + fVar128 * 0.0;
    fVar124 = auVar206._4_4_;
    auVar210._4_4_ = fVar124 + fVar153 * 0.14285715;
    fVar125 = auVar206._8_4_;
    auVar210._8_4_ = fVar125 + fVar156 * 0.2857143;
    fVar126 = auVar206._12_4_;
    auVar210._12_4_ = fVar126 + fVar159 * 0.42857146;
    auVar210._16_4_ = fVar98 + fVar128 * 0.5714286;
    auVar210._20_4_ = fVar124 + fVar153 * 0.71428573;
    auVar210._24_4_ = fVar125 + fVar156 * 0.8571429;
    auVar210._28_4_ = fVar126 + fVar159;
    auVar110 = vsubps_avx(auVar232,auVar210);
    local_a40._4_4_ = auVar210._4_4_ * auVar210._4_4_;
    local_a40._0_4_ = auVar210._0_4_ * auVar210._0_4_;
    fStack_a38 = auVar210._8_4_ * auVar210._8_4_;
    fStack_a34 = auVar210._12_4_ * auVar210._12_4_;
    fStack_a30 = auVar210._16_4_ * auVar210._16_4_;
    fStack_a2c = auVar210._20_4_ * auVar210._20_4_;
    fStack_a28 = auVar210._24_4_ * auVar210._24_4_;
    fStack_a24 = fVar126;
    fVar238 = auVar210._0_4_ * 3.0;
    fVar239 = auVar210._4_4_ * 3.0;
    fVar244 = auVar210._8_4_ * 3.0;
    fVar253 = auVar210._12_4_ * 3.0;
    fVar255 = auVar210._16_4_ * 3.0;
    fVar257 = auVar210._20_4_ * 3.0;
    fVar242 = auVar210._24_4_ * 3.0;
    fVar129 = auVar110._0_4_;
    auVar314._0_4_ = fVar129 * fVar129;
    fVar154 = auVar110._4_4_;
    auVar314._4_4_ = fVar154 * fVar154;
    fVar157 = auVar110._8_4_;
    auVar314._8_4_ = fVar157 * fVar157;
    fVar194 = auVar110._12_4_;
    auVar314._12_4_ = fVar194 * fVar194;
    fVar215 = auVar110._16_4_;
    auVar314._16_4_ = fVar215 * fVar215;
    fVar216 = auVar110._20_4_;
    auVar314._20_4_ = fVar216 * fVar216;
    fVar217 = auVar110._24_4_;
    auVar314._28_36_ = auVar313._28_36_;
    auVar314._24_4_ = fVar217 * fVar217;
    fVar219 = auVar110._28_4_;
    fVar245 = (auVar314._0_4_ * (fVar129 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar254 = (auVar314._4_4_ * (fVar154 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar256 = (auVar314._8_4_ * (fVar157 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar258 = (auVar314._12_4_ * (fVar194 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar259 = (auVar314._16_4_ * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar260 = (auVar314._20_4_ * (fVar216 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar261 = (auVar314._24_4_ * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar315 = -fVar129 * auVar210._0_4_ * auVar210._0_4_ * 0.5;
    fVar319 = -fVar154 * auVar210._4_4_ * auVar210._4_4_ * 0.5;
    fVar321 = -fVar157 * auVar210._8_4_ * auVar210._8_4_ * 0.5;
    fVar323 = -fVar194 * auVar210._12_4_ * auVar210._12_4_ * 0.5;
    fVar325 = -fVar215 * auVar210._16_4_ * auVar210._16_4_ * 0.5;
    fVar328 = -fVar216 * auVar210._20_4_ * auVar210._20_4_ * 0.5;
    fVar331 = -fVar217 * auVar210._24_4_ * auVar210._24_4_ * 0.5;
    fVar240 = auVar17._0_4_;
    fVar241 = auVar17._4_4_;
    fVar243 = auVar17._8_4_;
    fVar275 = auVar17._12_4_;
    fVar355 = auVar29._0_4_;
    fVar361 = auVar29._4_4_;
    fVar364 = auVar29._8_4_;
    fVar367 = auVar29._12_4_;
    fVar237 = local_4a0._28_4_;
    fVar354 = auVar353._28_4_ + fVar237;
    fVar377 = (auVar210._0_4_ * auVar210._0_4_ * (fVar238 + -5.0) + 2.0) * 0.5;
    fVar387 = (auVar210._4_4_ * auVar210._4_4_ * (fVar239 + -5.0) + 2.0) * 0.5;
    fVar390 = (auVar210._8_4_ * auVar210._8_4_ * (fVar244 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar210._12_4_ * auVar210._12_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar396 = (auVar210._16_4_ * auVar210._16_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar399 = (auVar210._20_4_ * auVar210._20_4_ * (fVar257 + -5.0) + 2.0) * 0.5;
    fVar402 = (auVar210._24_4_ * auVar210._24_4_ * (fVar242 + -5.0) + 2.0) * 0.5;
    fVar376 = -auVar210._28_4_;
    fVar356 = -auVar210._0_4_ * fVar129 * fVar129 * 0.5;
    fVar362 = -auVar210._4_4_ * fVar154 * fVar154 * 0.5;
    fVar365 = -auVar210._8_4_ * fVar157 * fVar157 * 0.5;
    fVar368 = -auVar210._12_4_ * fVar194 * fVar194 * 0.5;
    fVar370 = -auVar210._16_4_ * fVar215 * fVar215 * 0.5;
    fVar372 = -auVar210._20_4_ * fVar216 * fVar216 * 0.5;
    fVar374 = -auVar210._24_4_ * fVar217 * fVar217 * 0.5;
    local_960 = fVar356 * (float)local_380._0_4_ +
                fVar377 * (float)local_3a0._0_4_ + fVar240 * fVar315 + local_4a0._0_4_ * fVar245;
    fStack_95c = fVar362 * (float)local_380._4_4_ +
                 fVar387 * (float)local_3a0._4_4_ + fVar241 * fVar319 + local_4a0._4_4_ * fVar254;
    fStack_958 = fVar365 * fStack_378 +
                 fVar390 * fStack_398 + fVar243 * fVar321 + local_4a0._8_4_ * fVar256;
    fStack_954 = fVar368 * fStack_374 +
                 fVar393 * fStack_394 + fVar275 * fVar323 + local_4a0._12_4_ * fVar258;
    fStack_950 = fVar370 * fStack_370 +
                 fVar396 * fStack_390 + fVar240 * fVar325 + local_4a0._16_4_ * fVar259;
    fStack_94c = fVar372 * fStack_36c +
                 fVar399 * fStack_38c + fVar241 * fVar328 + local_4a0._20_4_ * fVar260;
    fStack_948 = fVar374 * fStack_368 +
                 fVar402 * fStack_388 + fVar243 * fVar331 + local_4a0._24_4_ * fVar261;
    fStack_944 = fVar237 + 2.0 + -fVar219 + fVar275 + fVar237;
    fVar316 = (float)local_1e0._0_4_ * fVar356 +
              fVar377 * (float)local_3c0._0_4_ +
              fVar355 * fVar315 + fVar245 * (float)local_420._0_4_;
    fVar320 = (float)local_1e0._4_4_ * fVar362 +
              fVar387 * (float)local_3c0._4_4_ +
              fVar361 * fVar319 + fVar254 * (float)local_420._4_4_;
    fVar322 = fStack_1d8 * fVar365 + fVar390 * fStack_3b8 + fVar364 * fVar321 + fVar256 * fStack_418
    ;
    fVar324 = fStack_1d4 * fVar368 + fVar393 * fStack_3b4 + fVar367 * fVar323 + fVar258 * fStack_414
    ;
    fVar326 = fStack_1d0 * fVar370 + fVar396 * fStack_3b0 + fVar355 * fVar325 + fVar259 * fStack_410
    ;
    fVar329 = fStack_1cc * fVar372 + fVar399 * fStack_3ac + fVar361 * fVar328 + fVar260 * fStack_40c
    ;
    fVar332 = fStack_1c8 * fVar374 + fVar402 * fStack_3a8 + fVar364 * fVar331 + fVar261 * fStack_408
    ;
    fVar334 = fStack_944 + fVar275 + fVar237 + fVar354;
    fVar164 = (float)local_200._0_4_ * fVar356 +
              fVar377 * (float)local_3e0._0_4_ +
              fVar315 * (float)local_480._0_4_ + fVar245 * (float)local_440._0_4_;
    fVar187 = (float)local_200._4_4_ * fVar362 +
              fVar387 * (float)local_3e0._4_4_ +
              fVar319 * (float)local_480._4_4_ + fVar254 * (float)local_440._4_4_;
    fVar188 = fStack_1f8 * fVar365 +
              fVar390 * fStack_3d8 + fVar321 * fStack_478 + fVar256 * fStack_438;
    fVar189 = fStack_1f4 * fVar368 +
              fVar393 * fStack_3d4 + fVar323 * fStack_474 + fVar258 * fStack_434;
    fVar190 = fStack_1f0 * fVar370 +
              fVar396 * fStack_3d0 + fVar325 * fStack_470 + fVar259 * fStack_430;
    fVar191 = fStack_1ec * fVar372 +
              fVar399 * fStack_3cc + fVar328 * fStack_46c + fVar260 * fStack_42c;
    fVar192 = fStack_1e8 * fVar374 +
              fVar402 * fStack_3c8 + fVar331 * fStack_468 + fVar261 * fStack_428;
    fVar193 = fVar334 + fVar354 + fVar367 + fVar237;
    local_820._0_4_ =
         (float)local_220._0_4_ * fVar356 +
         fVar377 * (float)local_400._0_4_ +
         fVar315 * (float)local_240._0_4_ + fVar245 * (float)local_460._0_4_;
    local_820._4_4_ =
         (float)local_220._4_4_ * fVar362 +
         fVar387 * (float)local_400._4_4_ +
         fVar319 * (float)local_240._4_4_ + fVar254 * (float)local_460._4_4_;
    local_820._8_4_ =
         fStack_218 * fVar365 + fVar390 * fStack_3f8 + fVar321 * fStack_238 + fVar256 * fStack_458;
    local_820._12_4_ =
         fStack_214 * fVar368 + fVar393 * fStack_3f4 + fVar323 * fStack_234 + fVar258 * fStack_454;
    local_820._16_4_ =
         fStack_210 * fVar370 + fVar396 * fStack_3f0 + fVar325 * fStack_230 + fVar259 * fStack_450;
    local_820._20_4_ =
         fStack_20c * fVar372 + fVar399 * fStack_3ec + fVar328 * fStack_22c + fVar260 * fStack_44c;
    local_820._24_4_ =
         fStack_208 * fVar374 + fVar402 * fStack_3e8 + fVar331 * fStack_228 + fVar261 * fStack_448;
    local_820._28_4_ = fVar334 + fVar237 + 2.0 + -fVar219 + -3.0;
    auVar33._4_4_ = (fVar154 + fVar154) * auVar210._4_4_;
    auVar33._0_4_ = (fVar129 + fVar129) * auVar210._0_4_;
    auVar33._8_4_ = (fVar157 + fVar157) * auVar210._8_4_;
    auVar33._12_4_ = (fVar194 + fVar194) * auVar210._12_4_;
    auVar33._16_4_ = (fVar215 + fVar215) * auVar210._16_4_;
    auVar33._20_4_ = (fVar216 + fVar216) * auVar210._20_4_;
    auVar33._24_4_ = (fVar217 + fVar217) * auVar210._24_4_;
    auVar33._28_4_ = auVar210._28_4_ + auVar210._28_4_;
    auVar110 = vsubps_avx(auVar33,auVar314._0_32_);
    auVar31._4_4_ = (fVar154 + fVar154) * (fVar239 + 2.0);
    auVar31._0_4_ = (fVar129 + fVar129) * (fVar238 + 2.0);
    auVar31._8_4_ = (fVar157 + fVar157) * (fVar244 + 2.0);
    auVar31._12_4_ = (fVar194 + fVar194) * (fVar253 + 2.0);
    auVar31._16_4_ = (fVar215 + fVar215) * (fVar255 + 2.0);
    auVar31._20_4_ = (fVar216 + fVar216) * (fVar257 + 2.0);
    auVar31._24_4_ = (fVar217 + fVar217) * (fVar242 + 2.0);
    auVar31._28_4_ = 0x40400000;
    auVar32._4_4_ = fVar154 * fVar154 * 3.0;
    auVar32._0_4_ = fVar129 * fVar129 * 3.0;
    auVar32._8_4_ = fVar157 * fVar157 * 3.0;
    auVar32._12_4_ = fVar194 * fVar194 * 3.0;
    auVar32._16_4_ = fVar215 * fVar215 * 3.0;
    auVar32._20_4_ = fVar216 * fVar216 * 3.0;
    auVar32._24_4_ = fVar217 * fVar217 * 3.0;
    auVar32._28_4_ = fVar219;
    auVar111 = vsubps_avx(auVar31,auVar32);
    auVar33 = vsubps_avx(_local_a40,auVar33);
    fVar323 = auVar110._0_4_ * 0.5;
    fVar325 = auVar110._4_4_ * 0.5;
    fVar328 = auVar110._8_4_ * 0.5;
    fVar331 = auVar110._12_4_ * 0.5;
    fVar354 = auVar110._16_4_ * 0.5;
    fVar356 = auVar110._20_4_ * 0.5;
    fVar362 = auVar110._24_4_ * 0.5;
    fVar245 = (auVar210._0_4_ * fVar238 + (auVar210._0_4_ + auVar210._0_4_) * (fVar238 + -5.0)) *
              0.5;
    fVar256 = (auVar210._4_4_ * fVar239 + (auVar210._4_4_ + auVar210._4_4_) * (fVar239 + -5.0)) *
              0.5;
    fVar260 = (auVar210._8_4_ * fVar244 + (auVar210._8_4_ + auVar210._8_4_) * (fVar244 + -5.0)) *
              0.5;
    fVar261 = (auVar210._12_4_ * fVar253 + (auVar210._12_4_ + auVar210._12_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar315 = (auVar210._16_4_ * fVar255 + (auVar210._16_4_ + auVar210._16_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar319 = (auVar210._20_4_ * fVar257 + (auVar210._20_4_ + auVar210._20_4_) * (fVar257 + -5.0)) *
              0.5;
    fVar321 = (auVar210._24_4_ * fVar242 + (auVar210._24_4_ + auVar210._24_4_) * (fVar242 + -5.0)) *
              0.5;
    fVar129 = auVar111._0_4_ * 0.5;
    fVar154 = auVar111._4_4_ * 0.5;
    fVar157 = auVar111._8_4_ * 0.5;
    fVar194 = auVar111._12_4_ * 0.5;
    fVar215 = auVar111._16_4_ * 0.5;
    fVar216 = auVar111._20_4_ * 0.5;
    fVar239 = auVar111._24_4_ * 0.5;
    fVar238 = auVar33._0_4_ * 0.5;
    fVar244 = auVar33._4_4_ * 0.5;
    fVar253 = auVar33._8_4_ * 0.5;
    fVar255 = auVar33._12_4_ * 0.5;
    fVar257 = auVar33._16_4_ * 0.5;
    fVar258 = auVar33._20_4_ * 0.5;
    fVar259 = auVar33._24_4_ * 0.5;
    fVar304 = fVar219 + fVar219 + auVar110._28_4_ + fVar219 + fVar219 + -4.0;
    auVar206 = vpermilps_avx(ZEXT416((uint)(auVar172._0_4_ * 0.04761905)),0);
    fVar217 = auVar206._0_4_;
    fVar280 = fVar217 * (fVar323 * (float)local_380._0_4_ +
                        fVar245 * (float)local_3a0._0_4_ +
                        fVar129 * local_4a0._0_4_ + fVar240 * fVar238);
    fVar237 = auVar206._4_4_;
    fVar293 = fVar237 * (fVar325 * (float)local_380._4_4_ +
                        fVar256 * (float)local_3a0._4_4_ +
                        fVar154 * local_4a0._4_4_ + fVar241 * fVar244);
    auVar37._4_4_ = fVar293;
    auVar37._0_4_ = fVar280;
    fVar242 = auVar206._8_4_;
    fVar294 = fVar242 * (fVar328 * fStack_378 +
                        fVar260 * fStack_398 + fVar157 * local_4a0._8_4_ + fVar243 * fVar253);
    auVar37._8_4_ = fVar294;
    fVar254 = auVar206._12_4_;
    fVar296 = fVar254 * (fVar331 * fStack_374 +
                        fVar261 * fStack_394 + fVar194 * local_4a0._12_4_ + fVar275 * fVar255);
    auVar37._12_4_ = fVar296;
    fVar298 = fVar217 * (fVar354 * fStack_370 +
                        fVar315 * fStack_390 + fVar215 * local_4a0._16_4_ + fVar240 * fVar257);
    auVar37._16_4_ = fVar298;
    fVar300 = fVar237 * (fVar356 * fStack_36c +
                        fVar319 * fStack_38c + fVar216 * local_4a0._20_4_ + fVar241 * fVar258);
    auVar37._20_4_ = fVar300;
    fVar302 = fVar242 * (fVar362 * fStack_368 +
                        fVar321 * fStack_388 + fVar239 * local_4a0._24_4_ + fVar243 * fVar259);
    auVar37._24_4_ = fVar302;
    auVar37._28_4_ = fVar304;
    fVar357 = fVar217 * ((float)local_1e0._0_4_ * fVar323 +
                        fVar245 * (float)local_3c0._0_4_ +
                        fVar129 * (float)local_420._0_4_ + fVar238 * fVar355);
    fVar363 = fVar237 * ((float)local_1e0._4_4_ * fVar325 +
                        fVar256 * (float)local_3c0._4_4_ +
                        fVar154 * (float)local_420._4_4_ + fVar244 * fVar361);
    auVar36._4_4_ = fVar363;
    auVar36._0_4_ = fVar357;
    fVar366 = fVar242 * (fStack_1d8 * fVar328 +
                        fVar260 * fStack_3b8 + fVar157 * fStack_418 + fVar253 * fVar364);
    auVar36._8_4_ = fVar366;
    fVar369 = fVar254 * (fStack_1d4 * fVar331 +
                        fVar261 * fStack_3b4 + fVar194 * fStack_414 + fVar255 * fVar367);
    auVar36._12_4_ = fVar369;
    fVar371 = fVar217 * (fStack_1d0 * fVar354 +
                        fVar315 * fStack_3b0 + fVar215 * fStack_410 + fVar257 * fVar355);
    auVar36._16_4_ = fVar371;
    fVar373 = fVar237 * (fStack_1cc * fVar356 +
                        fVar319 * fStack_3ac + fVar216 * fStack_40c + fVar258 * fVar361);
    auVar36._20_4_ = fVar373;
    fVar375 = fVar242 * (fStack_1c8 * fVar362 +
                        fVar321 * fStack_3a8 + fVar239 * fStack_408 + fVar259 * fVar364);
    auVar36._24_4_ = fVar375;
    auVar36._28_4_ = fVar376;
    fVar378 = fVar217 * ((float)local_200._0_4_ * fVar323 +
                        fVar129 * (float)local_440._0_4_ + fVar238 * (float)local_480._0_4_ +
                        fVar245 * (float)local_3e0._0_4_);
    fVar388 = fVar237 * ((float)local_200._4_4_ * fVar325 +
                        fVar154 * (float)local_440._4_4_ + fVar244 * (float)local_480._4_4_ +
                        fVar256 * (float)local_3e0._4_4_);
    auVar360._4_4_ = fVar388;
    auVar360._0_4_ = fVar378;
    fVar391 = fVar242 * (fStack_1f8 * fVar328 +
                        fVar157 * fStack_438 + fVar253 * fStack_478 + fVar260 * fStack_3d8);
    auVar360._8_4_ = fVar391;
    fVar394 = fVar254 * (fStack_1f4 * fVar331 +
                        fVar194 * fStack_434 + fVar255 * fStack_474 + fVar261 * fStack_3d4);
    auVar360._12_4_ = fVar394;
    fVar397 = fVar217 * (fStack_1f0 * fVar354 +
                        fVar215 * fStack_430 + fVar257 * fStack_470 + fVar315 * fStack_3d0);
    auVar360._16_4_ = fVar397;
    fVar400 = fVar237 * (fStack_1ec * fVar356 +
                        fVar216 * fStack_42c + fVar258 * fStack_46c + fVar319 * fStack_3cc);
    auVar360._20_4_ = fVar400;
    fVar403 = fVar242 * (fStack_1e8 * fVar362 +
                        fVar239 * fStack_428 + fVar259 * fStack_468 + fVar321 * fStack_3c8);
    auVar360._24_4_ = fVar403;
    auVar360._28_4_ = uStack_1c4;
    fVar219 = fVar217 * ((float)local_220._0_4_ * fVar323 +
                        fVar245 * (float)local_400._0_4_ +
                        fVar129 * (float)local_460._0_4_ + (float)local_240._0_4_ * fVar238);
    fVar238 = fVar237 * ((float)local_220._4_4_ * fVar325 +
                        fVar256 * (float)local_400._4_4_ +
                        fVar154 * (float)local_460._4_4_ + (float)local_240._4_4_ * fVar244);
    auVar144._4_4_ = fVar238;
    auVar144._0_4_ = fVar219;
    fVar245 = fVar242 * (fStack_218 * fVar328 +
                        fVar260 * fStack_3f8 + fVar157 * fStack_458 + fStack_238 * fVar253);
    auVar144._8_4_ = fVar245;
    fVar256 = fVar254 * (fStack_214 * fVar331 +
                        fVar261 * fStack_3f4 + fVar194 * fStack_454 + fStack_234 * fVar255);
    auVar144._12_4_ = fVar256;
    fVar217 = fVar217 * (fStack_210 * fVar354 +
                        fVar315 * fStack_3f0 + fVar215 * fStack_450 + fStack_230 * fVar257);
    auVar144._16_4_ = fVar217;
    fVar237 = fVar237 * (fStack_20c * fVar356 +
                        fVar319 * fStack_3ec + fVar216 * fStack_44c + fStack_22c * fVar258);
    auVar144._20_4_ = fVar237;
    fVar242 = fVar242 * (fStack_208 * fVar362 +
                        fVar321 * fStack_3e8 + fVar239 * fStack_448 + fStack_228 * fVar259);
    auVar144._24_4_ = fVar242;
    auVar144._28_4_ = fVar254;
    auVar83._4_4_ = fVar320;
    auVar83._0_4_ = fVar316;
    auVar83._8_4_ = fVar322;
    auVar83._12_4_ = fVar324;
    auVar83._16_4_ = fVar326;
    auVar83._20_4_ = fVar329;
    auVar83._24_4_ = fVar332;
    auVar83._28_4_ = fVar334;
    auVar110 = vperm2f128_avx(auVar83,auVar83,1);
    auVar110 = vshufps_avx(auVar110,auVar83,0x30);
    auVar31 = vshufps_avx(auVar83,auVar110,0x29);
    auVar81._4_4_ = fVar187;
    auVar81._0_4_ = fVar164;
    auVar81._8_4_ = fVar188;
    auVar81._12_4_ = fVar189;
    auVar81._16_4_ = fVar190;
    auVar81._20_4_ = fVar191;
    auVar81._24_4_ = fVar192;
    auVar81._28_4_ = fVar193;
    auVar110 = vperm2f128_avx(auVar81,auVar81,1);
    auVar110 = vshufps_avx(auVar110,auVar81,0x30);
    _local_a40 = vshufps_avx(auVar81,auVar110,0x29);
    auVar111 = vsubps_avx(local_820,auVar144);
    auVar110 = vperm2f128_avx(auVar111,auVar111,1);
    auVar110 = vshufps_avx(auVar110,auVar111,0x30);
    auVar32 = vshufps_avx(auVar111,auVar110,0x29);
    auVar33 = vsubps_avx(auVar31,auVar83);
    auVar386 = vsubps_avx(_local_a40,auVar81);
    fVar154 = auVar33._0_4_;
    fVar239 = auVar33._4_4_;
    auVar34._4_4_ = fVar388 * fVar239;
    auVar34._0_4_ = fVar378 * fVar154;
    fVar258 = auVar33._8_4_;
    auVar34._8_4_ = fVar391 * fVar258;
    fVar328 = auVar33._12_4_;
    auVar34._12_4_ = fVar394 * fVar328;
    fVar355 = auVar33._16_4_;
    auVar34._16_4_ = fVar397 * fVar355;
    fVar387 = auVar33._20_4_;
    auVar34._20_4_ = fVar400 * fVar387;
    fVar20 = auVar33._24_4_;
    auVar34._24_4_ = fVar403 * fVar20;
    auVar34._28_4_ = auVar111._28_4_;
    fVar157 = auVar386._0_4_;
    fVar244 = auVar386._4_4_;
    auVar311._4_4_ = fVar363 * fVar244;
    auVar311._0_4_ = fVar357 * fVar157;
    fVar259 = auVar386._8_4_;
    auVar311._8_4_ = fVar366 * fVar259;
    fVar331 = auVar386._12_4_;
    auVar311._12_4_ = fVar369 * fVar331;
    fVar361 = auVar386._16_4_;
    auVar311._16_4_ = fVar371 * fVar361;
    fVar390 = auVar386._20_4_;
    auVar311._20_4_ = fVar373 * fVar390;
    fVar21 = auVar386._24_4_;
    auVar311._24_4_ = fVar375 * fVar21;
    auVar311._28_4_ = auVar110._28_4_;
    auVar144 = vsubps_avx(auVar311,auVar34);
    auVar85._4_4_ = fStack_95c;
    auVar85._0_4_ = local_960;
    auVar85._8_4_ = fStack_958;
    auVar85._12_4_ = fStack_954;
    auVar85._16_4_ = fStack_950;
    auVar85._20_4_ = fStack_94c;
    auVar85._24_4_ = fStack_948;
    auVar85._28_4_ = fStack_944;
    auVar110 = vperm2f128_avx(auVar85,auVar85,1);
    auVar110 = vshufps_avx(auVar110,auVar85,0x30);
    local_9c0 = vshufps_avx(auVar85,auVar110,0x29);
    auVar34 = vsubps_avx(local_9c0,auVar85);
    auVar312._4_4_ = fVar244 * fVar293;
    auVar312._0_4_ = fVar157 * fVar280;
    auVar312._8_4_ = fVar259 * fVar294;
    auVar312._12_4_ = fVar331 * fVar296;
    auVar312._16_4_ = fVar361 * fVar298;
    auVar312._20_4_ = fVar390 * fVar300;
    auVar312._24_4_ = fVar21 * fVar302;
    auVar312._28_4_ = auVar110._28_4_;
    fVar194 = auVar34._0_4_;
    fVar253 = auVar34._4_4_;
    auVar35._4_4_ = fVar388 * fVar253;
    auVar35._0_4_ = fVar378 * fVar194;
    fVar260 = auVar34._8_4_;
    auVar35._8_4_ = fVar391 * fVar260;
    fVar354 = auVar34._12_4_;
    auVar35._12_4_ = fVar394 * fVar354;
    fVar364 = auVar34._16_4_;
    auVar35._16_4_ = fVar397 * fVar364;
    fVar393 = auVar34._20_4_;
    auVar35._20_4_ = fVar400 * fVar393;
    fVar22 = auVar34._24_4_;
    auVar35._24_4_ = fVar403 * fVar22;
    auVar35._28_4_ = local_a40._28_4_;
    auVar311 = vsubps_avx(auVar35,auVar312);
    auVar38._4_4_ = fVar363 * fVar253;
    auVar38._0_4_ = fVar357 * fVar194;
    auVar38._8_4_ = fVar366 * fVar260;
    auVar38._12_4_ = fVar369 * fVar354;
    auVar38._16_4_ = fVar371 * fVar364;
    auVar38._20_4_ = fVar373 * fVar393;
    auVar38._24_4_ = fVar375 * fVar22;
    auVar38._28_4_ = local_a40._28_4_;
    auVar39._4_4_ = fVar239 * fVar293;
    auVar39._0_4_ = fVar154 * fVar280;
    auVar39._8_4_ = fVar258 * fVar294;
    auVar39._12_4_ = fVar328 * fVar296;
    auVar39._16_4_ = fVar355 * fVar298;
    auVar39._20_4_ = fVar387 * fVar300;
    auVar39._24_4_ = fVar20 * fVar302;
    auVar39._28_4_ = fVar193;
    auVar312 = vsubps_avx(auVar39,auVar38);
    fVar129 = auVar312._28_4_;
    fVar319 = auVar311._28_4_ + fVar129;
    auVar211._0_4_ = fVar194 * fVar194 + fVar154 * fVar154 + fVar157 * fVar157;
    auVar211._4_4_ = fVar253 * fVar253 + fVar239 * fVar239 + fVar244 * fVar244;
    auVar211._8_4_ = fVar260 * fVar260 + fVar258 * fVar258 + fVar259 * fVar259;
    auVar211._12_4_ = fVar354 * fVar354 + fVar328 * fVar328 + fVar331 * fVar331;
    auVar211._16_4_ = fVar364 * fVar364 + fVar355 * fVar355 + fVar361 * fVar361;
    auVar211._20_4_ = fVar393 * fVar393 + fVar387 * fVar387 + fVar390 * fVar390;
    auVar211._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar211._28_4_ = fVar129 + fVar129 + fVar319;
    auVar110 = vrcpps_avx(auVar211);
    fVar129 = auVar110._0_4_;
    fVar321 = auVar110._4_4_;
    auVar40._4_4_ = fVar321 * auVar211._4_4_;
    auVar40._0_4_ = fVar129 * auVar211._0_4_;
    fVar323 = auVar110._8_4_;
    auVar40._8_4_ = fVar323 * auVar211._8_4_;
    fVar325 = auVar110._12_4_;
    auVar40._12_4_ = fVar325 * auVar211._12_4_;
    fVar240 = auVar110._16_4_;
    auVar40._16_4_ = fVar240 * auVar211._16_4_;
    fVar241 = auVar110._20_4_;
    auVar40._20_4_ = fVar241 * auVar211._20_4_;
    fVar243 = auVar110._24_4_;
    auVar40._24_4_ = fVar243 * auVar211._24_4_;
    auVar40._28_4_ = fVar193;
    auVar177._8_4_ = 0x3f800000;
    auVar177._0_8_ = 0x3f8000003f800000;
    auVar177._12_4_ = 0x3f800000;
    auVar177._16_4_ = 0x3f800000;
    auVar177._20_4_ = 0x3f800000;
    auVar177._24_4_ = 0x3f800000;
    auVar177._28_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar177,auVar40);
    fVar129 = auVar35._0_4_ * fVar129 + fVar129;
    fVar321 = auVar35._4_4_ * fVar321 + fVar321;
    fVar323 = auVar35._8_4_ * fVar323 + fVar323;
    fVar325 = auVar35._12_4_ * fVar325 + fVar325;
    fVar240 = auVar35._16_4_ * fVar240 + fVar240;
    fVar241 = auVar35._20_4_ * fVar241 + fVar241;
    fVar243 = auVar35._24_4_ * fVar243 + fVar243;
    auVar111 = vperm2f128_avx(auVar36,auVar36,1);
    auVar111 = vshufps_avx(auVar111,auVar36,0x30);
    local_9e0 = vshufps_avx(auVar36,auVar111,0x29);
    auVar111 = vperm2f128_avx(auVar360,auVar360,1);
    auVar111 = vshufps_avx(auVar111,auVar360,0x30);
    local_a00 = vshufps_avx(auVar360,auVar111,0x29);
    fVar379 = local_a00._0_4_;
    fVar389 = local_a00._4_4_;
    auVar41._4_4_ = fVar389 * fVar239;
    auVar41._0_4_ = fVar379 * fVar154;
    fVar392 = local_a00._8_4_;
    auVar41._8_4_ = fVar392 * fVar258;
    fVar395 = local_a00._12_4_;
    auVar41._12_4_ = fVar395 * fVar328;
    fVar398 = local_a00._16_4_;
    auVar41._16_4_ = fVar398 * fVar355;
    fVar401 = local_a00._20_4_;
    auVar41._20_4_ = fVar401 * fVar387;
    fVar404 = local_a00._24_4_;
    auVar41._24_4_ = fVar404 * fVar20;
    auVar41._28_4_ = auVar111._28_4_;
    fVar215 = local_9e0._0_4_;
    fVar255 = local_9e0._4_4_;
    auVar42._4_4_ = fVar244 * fVar255;
    auVar42._0_4_ = fVar157 * fVar215;
    fVar261 = local_9e0._8_4_;
    auVar42._8_4_ = fVar259 * fVar261;
    fVar356 = local_9e0._12_4_;
    auVar42._12_4_ = fVar331 * fVar356;
    fVar365 = local_9e0._16_4_;
    auVar42._16_4_ = fVar361 * fVar365;
    fVar396 = local_9e0._20_4_;
    auVar42._20_4_ = fVar390 * fVar396;
    fVar23 = local_9e0._24_4_;
    auVar42._24_4_ = fVar21 * fVar23;
    auVar42._28_4_ = fVar376;
    auVar36 = vsubps_avx(auVar42,auVar41);
    auVar111 = vperm2f128_avx(auVar37,auVar37,1);
    auVar111 = vshufps_avx(auVar111,auVar37,0x30);
    auVar33 = vshufps_avx(auVar37,auVar111,0x29);
    fVar216 = auVar33._0_4_;
    fVar257 = auVar33._4_4_;
    auVar43._4_4_ = fVar244 * fVar257;
    auVar43._0_4_ = fVar157 * fVar216;
    fVar315 = auVar33._8_4_;
    auVar43._8_4_ = fVar259 * fVar315;
    fVar362 = auVar33._12_4_;
    auVar43._12_4_ = fVar331 * fVar362;
    fVar368 = auVar33._16_4_;
    auVar43._16_4_ = fVar361 * fVar368;
    fVar399 = auVar33._20_4_;
    auVar43._20_4_ = fVar390 * fVar399;
    fVar24 = auVar33._24_4_;
    auVar43._24_4_ = fVar21 * fVar24;
    auVar43._28_4_ = auVar111._28_4_;
    auVar44._4_4_ = fVar389 * fVar253;
    auVar44._0_4_ = fVar379 * fVar194;
    auVar44._8_4_ = fVar392 * fVar260;
    auVar44._12_4_ = fVar395 * fVar354;
    auVar44._16_4_ = fVar398 * fVar364;
    auVar44._20_4_ = fVar401 * fVar393;
    uVar92 = local_a00._28_4_;
    auVar44._24_4_ = fVar404 * fVar22;
    auVar44._28_4_ = uVar92;
    auVar111 = vsubps_avx(auVar44,auVar43);
    auVar45._4_4_ = fVar253 * fVar255;
    auVar45._0_4_ = fVar194 * fVar215;
    auVar45._8_4_ = fVar260 * fVar261;
    auVar45._12_4_ = fVar354 * fVar356;
    auVar45._16_4_ = fVar364 * fVar365;
    auVar45._20_4_ = fVar393 * fVar396;
    auVar45._24_4_ = fVar22 * fVar23;
    auVar45._28_4_ = uVar92;
    auVar46._4_4_ = fVar239 * fVar257;
    auVar46._0_4_ = fVar154 * fVar216;
    auVar46._8_4_ = fVar258 * fVar315;
    auVar46._12_4_ = fVar328 * fVar362;
    auVar46._16_4_ = fVar355 * fVar368;
    auVar46._20_4_ = fVar387 * fVar399;
    auVar46._24_4_ = fVar20 * fVar24;
    auVar46._28_4_ = fStack_204;
    auVar37 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ =
         (auVar144._4_4_ * auVar144._4_4_ +
         auVar311._4_4_ * auVar311._4_4_ + auVar312._4_4_ * auVar312._4_4_) * fVar321;
    auVar47._0_4_ =
         (auVar144._0_4_ * auVar144._0_4_ +
         auVar311._0_4_ * auVar311._0_4_ + auVar312._0_4_ * auVar312._0_4_) * fVar129;
    auVar47._8_4_ =
         (auVar144._8_4_ * auVar144._8_4_ +
         auVar311._8_4_ * auVar311._8_4_ + auVar312._8_4_ * auVar312._8_4_) * fVar323;
    auVar47._12_4_ =
         (auVar144._12_4_ * auVar144._12_4_ +
         auVar311._12_4_ * auVar311._12_4_ + auVar312._12_4_ * auVar312._12_4_) * fVar325;
    auVar47._16_4_ =
         (auVar144._16_4_ * auVar144._16_4_ +
         auVar311._16_4_ * auVar311._16_4_ + auVar312._16_4_ * auVar312._16_4_) * fVar240;
    auVar47._20_4_ =
         (auVar144._20_4_ * auVar144._20_4_ +
         auVar311._20_4_ * auVar311._20_4_ + auVar312._20_4_ * auVar312._20_4_) * fVar241;
    auVar47._24_4_ =
         (auVar144._24_4_ * auVar144._24_4_ +
         auVar311._24_4_ * auVar311._24_4_ + auVar312._24_4_ * auVar312._24_4_) * fVar243;
    auVar47._28_4_ = auVar144._28_4_ + fVar319;
    auVar48._4_4_ =
         (auVar36._4_4_ * auVar36._4_4_ +
         auVar111._4_4_ * auVar111._4_4_ + auVar37._4_4_ * auVar37._4_4_) * fVar321;
    auVar48._0_4_ =
         (auVar36._0_4_ * auVar36._0_4_ +
         auVar111._0_4_ * auVar111._0_4_ + auVar37._0_4_ * auVar37._0_4_) * fVar129;
    auVar48._8_4_ =
         (auVar36._8_4_ * auVar36._8_4_ +
         auVar111._8_4_ * auVar111._8_4_ + auVar37._8_4_ * auVar37._8_4_) * fVar323;
    auVar48._12_4_ =
         (auVar36._12_4_ * auVar36._12_4_ +
         auVar111._12_4_ * auVar111._12_4_ + auVar37._12_4_ * auVar37._12_4_) * fVar325;
    auVar48._16_4_ =
         (auVar36._16_4_ * auVar36._16_4_ +
         auVar111._16_4_ * auVar111._16_4_ + auVar37._16_4_ * auVar37._16_4_) * fVar240;
    auVar48._20_4_ =
         (auVar36._20_4_ * auVar36._20_4_ +
         auVar111._20_4_ * auVar111._20_4_ + auVar37._20_4_ * auVar37._20_4_) * fVar241;
    auVar48._24_4_ =
         (auVar36._24_4_ * auVar36._24_4_ +
         auVar111._24_4_ * auVar111._24_4_ + auVar37._24_4_ * auVar37._24_4_) * fVar243;
    auVar48._28_4_ = auVar35._28_4_ + auVar110._28_4_;
    auVar110 = vmaxps_avx(auVar47,auVar48);
    auVar111 = vperm2f128_avx(local_820,local_820,1);
    auVar111 = vshufps_avx(auVar111,local_820,0x30);
    auVar144 = vshufps_avx(local_820,auVar111,0x29);
    auVar112._0_4_ = (float)local_820._0_4_ + fVar219;
    auVar112._4_4_ = local_820._4_4_ + fVar238;
    auVar112._8_4_ = local_820._8_4_ + fVar245;
    auVar112._12_4_ = local_820._12_4_ + fVar256;
    auVar112._16_4_ = local_820._16_4_ + fVar217;
    auVar112._20_4_ = local_820._20_4_ + fVar237;
    auVar112._24_4_ = local_820._24_4_ + fVar242;
    auVar112._28_4_ = local_820._28_4_ + fVar254;
    auVar111 = vmaxps_avx(local_820,auVar112);
    auVar33 = vmaxps_avx(auVar32,auVar144);
    auVar111 = vmaxps_avx(auVar111,auVar33);
    auVar33 = vrsqrtps_avx(auVar211);
    fVar129 = auVar33._0_4_;
    fVar217 = auVar33._4_4_;
    fVar219 = auVar33._8_4_;
    fVar237 = auVar33._12_4_;
    fVar238 = auVar33._16_4_;
    fVar242 = auVar33._20_4_;
    fVar245 = auVar33._24_4_;
    auVar49._4_4_ = fVar217 * fVar217 * fVar217 * auVar211._4_4_ * 0.5;
    auVar49._0_4_ = fVar129 * fVar129 * fVar129 * auVar211._0_4_ * 0.5;
    auVar49._8_4_ = fVar219 * fVar219 * fVar219 * auVar211._8_4_ * 0.5;
    auVar49._12_4_ = fVar237 * fVar237 * fVar237 * auVar211._12_4_ * 0.5;
    auVar49._16_4_ = fVar238 * fVar238 * fVar238 * auVar211._16_4_ * 0.5;
    auVar49._20_4_ = fVar242 * fVar242 * fVar242 * auVar211._20_4_ * 0.5;
    auVar49._24_4_ = fVar245 * fVar245 * fVar245 * auVar211._24_4_ * 0.5;
    auVar49._28_4_ = auVar211._28_4_;
    auVar50._4_4_ = fVar217 * 1.5;
    auVar50._0_4_ = fVar129 * 1.5;
    auVar50._8_4_ = fVar219 * 1.5;
    auVar50._12_4_ = fVar237 * 1.5;
    auVar50._16_4_ = fVar238 * 1.5;
    auVar50._20_4_ = fVar242 * 1.5;
    auVar50._24_4_ = fVar245 * 1.5;
    auVar50._28_4_ = auVar33._28_4_;
    local_2c0 = vsubps_avx(auVar50,auVar49);
    auVar84._4_4_ = fVar320;
    auVar84._0_4_ = fVar316;
    auVar84._8_4_ = fVar322;
    auVar84._12_4_ = fVar324;
    auVar84._16_4_ = fVar326;
    auVar84._20_4_ = fVar329;
    auVar84._24_4_ = fVar332;
    auVar84._28_4_ = fVar334;
    auVar312 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar311 = vsubps_avx(auVar312,auVar84);
    auVar82._4_4_ = fVar187;
    auVar82._0_4_ = fVar164;
    auVar82._8_4_ = fVar188;
    auVar82._12_4_ = fVar189;
    auVar82._16_4_ = fVar190;
    auVar82._20_4_ = fVar191;
    auVar82._24_4_ = fVar192;
    auVar82._28_4_ = fVar193;
    auVar312 = vsubps_avx(auVar312,auVar82);
    fVar217 = auVar312._0_4_;
    fVar242 = auVar312._4_4_;
    fVar319 = auVar312._8_4_;
    fVar240 = auVar312._12_4_;
    fVar370 = auVar312._16_4_;
    fVar402 = auVar312._20_4_;
    fVar25 = auVar312._24_4_;
    fVar219 = auVar311._0_4_;
    fVar245 = auVar311._4_4_;
    fVar321 = auVar311._8_4_;
    fVar241 = auVar311._12_4_;
    fVar372 = auVar311._16_4_;
    fVar18 = auVar311._20_4_;
    fVar26 = auVar311._24_4_;
    auVar360 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar35 = vsubps_avx(auVar360,auVar85);
    fVar237 = auVar35._0_4_;
    fVar254 = auVar35._4_4_;
    fVar323 = auVar35._8_4_;
    fVar243 = auVar35._12_4_;
    fVar374 = auVar35._16_4_;
    fVar19 = auVar35._20_4_;
    fVar27 = auVar35._24_4_;
    auVar382._0_4_ =
         (float)local_860._0_4_ * fVar237 +
         (float)local_880._0_4_ * fVar219 + (float)local_840._0_4_ * fVar217;
    auVar382._4_4_ =
         (float)local_860._4_4_ * fVar254 +
         (float)local_880._4_4_ * fVar245 + (float)local_840._4_4_ * fVar242;
    auVar382._8_4_ = fStack_858 * fVar323 + fStack_878 * fVar321 + fStack_838 * fVar319;
    auVar382._12_4_ = fStack_854 * fVar243 + fStack_874 * fVar241 + fStack_834 * fVar240;
    auVar382._16_4_ = fStack_850 * fVar374 + fStack_870 * fVar372 + fStack_830 * fVar370;
    auVar382._20_4_ = fStack_84c * fVar19 + fStack_86c * fVar18 + fStack_82c * fVar402;
    auVar382._24_4_ = fStack_848 * fVar27 + fStack_868 * fVar26 + fStack_828 * fVar25;
    auVar382._28_4_ = fStack_204 + auVar37._28_4_ + auVar33._28_4_;
    auVar406._0_4_ = fVar237 * fVar237 + fVar219 * fVar219 + fVar217 * fVar217;
    auVar406._4_4_ = fVar254 * fVar254 + fVar245 * fVar245 + fVar242 * fVar242;
    auVar406._8_4_ = fVar323 * fVar323 + fVar321 * fVar321 + fVar319 * fVar319;
    auVar406._12_4_ = fVar243 * fVar243 + fVar241 * fVar241 + fVar240 * fVar240;
    auVar406._16_4_ = fVar374 * fVar374 + fVar372 * fVar372 + fVar370 * fVar370;
    auVar406._20_4_ = fVar19 * fVar19 + fVar18 * fVar18 + fVar402 * fVar402;
    auVar406._24_4_ = fVar27 * fVar27 + fVar26 * fVar26 + fVar25 * fVar25;
    auVar406._28_4_ = fStack_944 + fStack_944 + fStack_204;
    fVar238 = local_2c0._0_4_;
    fVar256 = local_2c0._4_4_;
    fVar325 = local_2c0._8_4_;
    fVar275 = local_2c0._12_4_;
    fVar377 = local_2c0._16_4_;
    fVar277 = local_2c0._20_4_;
    fVar279 = local_2c0._24_4_;
    local_560._0_4_ =
         (float)local_860._0_4_ * fVar194 * fVar238 +
         fVar154 * fVar238 * (float)local_880._0_4_ + fVar157 * fVar238 * (float)local_840._0_4_;
    local_560._4_4_ =
         (float)local_860._4_4_ * fVar253 * fVar256 +
         fVar239 * fVar256 * (float)local_880._4_4_ + fVar244 * fVar256 * (float)local_840._4_4_;
    local_560._8_4_ =
         fStack_858 * fVar260 * fVar325 +
         fVar258 * fVar325 * fStack_878 + fVar259 * fVar325 * fStack_838;
    local_560._12_4_ =
         fStack_854 * fVar354 * fVar275 +
         fVar328 * fVar275 * fStack_874 + fVar331 * fVar275 * fStack_834;
    local_560._16_4_ =
         fStack_850 * fVar364 * fVar377 +
         fVar355 * fVar377 * fStack_870 + fVar361 * fVar377 * fStack_830;
    local_560._20_4_ =
         fStack_84c * fVar393 * fVar277 +
         fVar387 * fVar277 * fStack_86c + fVar390 * fVar277 * fStack_82c;
    local_560._24_4_ =
         fStack_848 * fVar22 * fVar279 +
         fVar20 * fVar279 * fStack_868 + fVar21 * fVar279 * fStack_828;
    local_560._28_4_ = fStack_844 + fStack_864 + fStack_824;
    fVar129 = fStack_844 + fStack_864 + fStack_824;
    fVar335 = fVar237 * fVar194 * fVar238 +
              fVar154 * fVar238 * fVar219 + fVar157 * fVar238 * fVar217;
    fVar342 = fVar254 * fVar253 * fVar256 +
              fVar239 * fVar256 * fVar245 + fVar244 * fVar256 * fVar242;
    fVar343 = fVar323 * fVar260 * fVar325 +
              fVar258 * fVar325 * fVar321 + fVar259 * fVar325 * fVar319;
    fVar344 = fVar243 * fVar354 * fVar275 +
              fVar328 * fVar275 * fVar241 + fVar331 * fVar275 * fVar240;
    fVar345 = fVar374 * fVar364 * fVar377 +
              fVar355 * fVar377 * fVar372 + fVar361 * fVar377 * fVar370;
    fVar346 = fVar19 * fVar393 * fVar277 + fVar387 * fVar277 * fVar18 + fVar390 * fVar277 * fVar402;
    fVar347 = fVar27 * fVar22 * fVar279 + fVar20 * fVar279 * fVar26 + fVar21 * fVar279 * fVar25;
    fVar348 = fStack_864 + fVar129;
    auVar51._4_4_ = local_560._4_4_ * fVar342;
    auVar51._0_4_ = local_560._0_4_ * fVar335;
    auVar51._8_4_ = local_560._8_4_ * fVar343;
    auVar51._12_4_ = local_560._12_4_ * fVar344;
    auVar51._16_4_ = local_560._16_4_ * fVar345;
    auVar51._20_4_ = local_560._20_4_ * fVar346;
    auVar51._24_4_ = local_560._24_4_ * fVar347;
    auVar51._28_4_ = fVar129;
    auVar36 = vsubps_avx(auVar382,auVar51);
    auVar52._4_4_ = fVar342 * fVar342;
    auVar52._0_4_ = fVar335 * fVar335;
    auVar52._8_4_ = fVar343 * fVar343;
    auVar52._12_4_ = fVar344 * fVar344;
    auVar52._16_4_ = fVar345 * fVar345;
    auVar52._20_4_ = fVar346 * fVar346;
    auVar52._24_4_ = fVar347 * fVar347;
    auVar52._28_4_ = fStack_864;
    auVar37 = vsubps_avx(auVar406,auVar52);
    auVar33 = vsqrtps_avx(auVar110);
    fVar129 = (auVar33._0_4_ + auVar111._0_4_) * 1.0000002;
    fVar155 = (auVar33._4_4_ + auVar111._4_4_) * 1.0000002;
    fVar158 = (auVar33._8_4_ + auVar111._8_4_) * 1.0000002;
    fVar160 = (auVar33._12_4_ + auVar111._12_4_) * 1.0000002;
    fVar161 = (auVar33._16_4_ + auVar111._16_4_) * 1.0000002;
    fVar162 = (auVar33._20_4_ + auVar111._20_4_) * 1.0000002;
    fVar163 = (auVar33._24_4_ + auVar111._24_4_) * 1.0000002;
    auVar53._4_4_ = fVar155 * fVar155;
    auVar53._0_4_ = fVar129 * fVar129;
    auVar53._8_4_ = fVar158 * fVar158;
    auVar53._12_4_ = fVar160 * fVar160;
    auVar53._16_4_ = fVar161 * fVar161;
    auVar53._20_4_ = fVar162 * fVar162;
    auVar53._24_4_ = fVar163 * fVar163;
    auVar53._28_4_ = auVar33._28_4_ + auVar111._28_4_;
    fVar155 = auVar36._0_4_ + auVar36._0_4_;
    fVar158 = auVar36._4_4_ + auVar36._4_4_;
    local_aa0._0_8_ = CONCAT44(fVar158,fVar155);
    local_aa0._8_4_ = auVar36._8_4_ + auVar36._8_4_;
    local_aa0._12_4_ = auVar36._12_4_ + auVar36._12_4_;
    local_aa0._16_4_ = auVar36._16_4_ + auVar36._16_4_;
    local_aa0._20_4_ = auVar36._20_4_ + auVar36._20_4_;
    local_aa0._24_4_ = auVar36._24_4_ + auVar36._24_4_;
    fVar129 = auVar36._28_4_;
    local_aa0._28_4_ = fVar129 + fVar129;
    auVar111 = vsubps_avx(auVar37,auVar53);
    local_2e0._4_4_ = local_560._4_4_ * local_560._4_4_;
    local_2e0._0_4_ = local_560._0_4_ * local_560._0_4_;
    local_2e0._8_4_ = local_560._8_4_ * local_560._8_4_;
    local_2e0._12_4_ = local_560._12_4_ * local_560._12_4_;
    local_2e0._16_4_ = local_560._16_4_ * local_560._16_4_;
    local_2e0._20_4_ = local_560._20_4_ * local_560._20_4_;
    local_2e0._24_4_ = local_560._24_4_ * local_560._24_4_;
    local_2e0._28_4_ = auVar386._28_4_;
    auVar353 = ZEXT3264(local_2e0);
    local_540 = vsubps_avx(local_260,local_2e0);
    auVar54._4_4_ = fVar158 * fVar158;
    auVar54._0_4_ = fVar155 * fVar155;
    auVar54._8_4_ = local_aa0._8_4_ * local_aa0._8_4_;
    auVar54._12_4_ = local_aa0._12_4_ * local_aa0._12_4_;
    auVar54._16_4_ = local_aa0._16_4_ * local_aa0._16_4_;
    auVar54._20_4_ = local_aa0._20_4_ * local_aa0._20_4_;
    auVar54._24_4_ = local_aa0._24_4_ * local_aa0._24_4_;
    auVar54._28_4_ = fVar129;
    auStack_938 = auVar54._8_24_;
    fVar160 = local_540._0_4_;
    fVar161 = local_540._4_4_;
    fVar162 = local_540._8_4_;
    fVar163 = local_540._12_4_;
    fVar327 = local_540._16_4_;
    fVar330 = local_540._20_4_;
    fVar333 = local_540._24_4_;
    auVar386._4_4_ = auVar111._4_4_ * fVar161 * 4.0;
    auVar386._0_4_ = auVar111._0_4_ * fVar160 * 4.0;
    auVar386._8_4_ = auVar111._8_4_ * fVar162 * 4.0;
    auVar386._12_4_ = auVar111._12_4_ * fVar163 * 4.0;
    auVar386._16_4_ = auVar111._16_4_ * fVar327 * 4.0;
    auVar386._20_4_ = auVar111._20_4_ * fVar330 * 4.0;
    auVar386._24_4_ = auVar111._24_4_ * fVar333 * 4.0;
    auVar386._28_4_ = 0x40800000;
    auVar386 = vsubps_avx(auVar54,auVar386);
    auVar110 = vcmpps_avx(auVar386,auVar360,5);
    fVar129 = local_540._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      fStack_c78 = INFINITY;
      local_c80 = (undefined1  [8])0x7f8000007f800000;
      fStack_c74 = INFINITY;
      uStack_c70 = 0x7f800000;
      uStack_c6c = 0x7f800000;
      uStack_c68 = 0x7f800000;
      uStack_c64 = 0x7f800000;
      auVar407._8_4_ = 0xff800000;
      auVar407._0_8_ = 0xff800000ff800000;
      auVar407._12_4_ = 0xff800000;
      auVar407._16_4_ = 0xff800000;
      auVar407._20_4_ = 0xff800000;
      auVar407._24_4_ = 0xff800000;
      auVar407._28_4_ = 0xff800000;
    }
    else {
      auVar36 = vcmpps_avx(auVar386,auVar360,5);
      auVar360 = vsqrtps_avx(auVar386);
      auVar266._0_4_ = fVar160 + fVar160;
      auVar266._4_4_ = fVar161 + fVar161;
      auVar266._8_4_ = fVar162 + fVar162;
      auVar266._12_4_ = fVar163 + fVar163;
      auVar266._16_4_ = fVar327 + fVar327;
      auVar266._20_4_ = fVar330 + fVar330;
      auVar266._24_4_ = fVar333 + fVar333;
      auVar266._28_4_ = fVar129 + fVar129;
      auVar386 = vrcpps_avx(auVar266);
      fVar262 = auVar386._0_4_;
      fVar272 = auVar386._4_4_;
      auVar55._4_4_ = auVar266._4_4_ * fVar272;
      auVar55._0_4_ = auVar266._0_4_ * fVar262;
      fVar273 = auVar386._8_4_;
      auVar55._8_4_ = auVar266._8_4_ * fVar273;
      fVar274 = auVar386._12_4_;
      auVar55._12_4_ = auVar266._12_4_ * fVar274;
      fVar218 = auVar386._16_4_;
      auVar55._16_4_ = auVar266._16_4_ * fVar218;
      fVar276 = auVar386._20_4_;
      auVar55._20_4_ = auVar266._20_4_ * fVar276;
      fVar278 = auVar386._24_4_;
      auVar55._24_4_ = auVar266._24_4_ * fVar278;
      auVar55._28_4_ = auVar266._28_4_;
      auVar309._8_4_ = 0x3f800000;
      auVar309._0_8_ = 0x3f8000003f800000;
      auVar309._12_4_ = 0x3f800000;
      auVar309._16_4_ = 0x3f800000;
      auVar309._20_4_ = 0x3f800000;
      auVar309._24_4_ = 0x3f800000;
      auVar309._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar309,auVar55);
      fVar262 = fVar262 + fVar262 * auVar38._0_4_;
      fVar272 = fVar272 + fVar272 * auVar38._4_4_;
      fVar273 = fVar273 + fVar273 * auVar38._8_4_;
      fVar274 = fVar274 + fVar274 * auVar38._12_4_;
      fVar218 = fVar218 + fVar218 * auVar38._16_4_;
      fVar276 = fVar276 + fVar276 * auVar38._20_4_;
      fVar278 = fVar278 + fVar278 * auVar38._24_4_;
      auVar287._0_8_ = CONCAT44(fVar158,fVar155) ^ 0x8000000080000000;
      auVar287._8_4_ = -local_aa0._8_4_;
      auVar287._12_4_ = -local_aa0._12_4_;
      auVar287._16_4_ = -local_aa0._16_4_;
      auVar287._20_4_ = -local_aa0._20_4_;
      auVar287._24_4_ = -local_aa0._24_4_;
      auVar287._28_4_ = -local_aa0._28_4_;
      auVar39 = vsubps_avx(auVar287,auVar360);
      fVar155 = auVar39._0_4_ * fVar262;
      fVar158 = auVar39._4_4_ * fVar272;
      auVar56._4_4_ = fVar158;
      auVar56._0_4_ = fVar155;
      fVar295 = auVar39._8_4_ * fVar273;
      auVar56._8_4_ = fVar295;
      fVar297 = auVar39._12_4_ * fVar274;
      auVar56._12_4_ = fVar297;
      fVar299 = auVar39._16_4_ * fVar218;
      auVar56._16_4_ = fVar299;
      fVar301 = auVar39._20_4_ * fVar276;
      auVar56._20_4_ = fVar301;
      fVar303 = auVar39._24_4_ * fVar278;
      auVar56._24_4_ = fVar303;
      auVar56._28_4_ = auVar39._28_4_;
      auVar360 = vsubps_avx(auVar360,local_aa0);
      fVar262 = auVar360._0_4_ * fVar262;
      fVar272 = auVar360._4_4_ * fVar272;
      auVar57._4_4_ = fVar272;
      auVar57._0_4_ = fVar262;
      fVar273 = auVar360._8_4_ * fVar273;
      auVar57._8_4_ = fVar273;
      fVar274 = auVar360._12_4_ * fVar274;
      auVar57._12_4_ = fVar274;
      fVar218 = auVar360._16_4_ * fVar218;
      auVar57._16_4_ = fVar218;
      fVar276 = auVar360._20_4_ * fVar276;
      auVar57._20_4_ = fVar276;
      fVar278 = auVar360._24_4_ * fVar278;
      auVar57._24_4_ = fVar278;
      auVar57._28_4_ = auVar360._28_4_;
      local_a60._4_4_ = fVar256 * (fVar342 + local_560._4_4_ * fVar158);
      local_a60._0_4_ = fVar238 * (fVar335 + local_560._0_4_ * fVar155);
      uStack_a58._0_4_ = (uint)(fVar325 * (fVar343 + local_560._8_4_ * fVar295));
      uStack_a58._4_4_ = (uint)(fVar275 * (fVar344 + local_560._12_4_ * fVar297));
      uStack_a50._0_4_ = (uint)(fVar377 * (fVar345 + local_560._16_4_ * fVar299));
      uStack_a50._4_4_ = (uint)(fVar277 * (fVar346 + local_560._20_4_ * fVar301));
      uStack_a48._0_4_ = (uint)(fVar279 * (fVar347 + local_560._24_4_ * fVar303));
      uStack_a48._4_4_ = (uint)(fVar348 + auVar386._28_4_ + auVar38._28_4_);
      auVar383._8_4_ = 0x7fffffff;
      auVar383._0_8_ = 0x7fffffff7fffffff;
      auVar383._12_4_ = 0x7fffffff;
      auVar383._16_4_ = 0x7fffffff;
      auVar383._20_4_ = 0x7fffffff;
      auVar383._24_4_ = 0x7fffffff;
      auVar383._28_4_ = 0x7fffffff;
      auVar386 = vandps_avx(local_2e0,auVar383);
      auVar360 = vmaxps_avx(local_4e0,auVar386);
      auVar58._4_4_ = auVar360._4_4_ * 1.9073486e-06;
      auVar58._0_4_ = auVar360._0_4_ * 1.9073486e-06;
      auVar58._8_4_ = auVar360._8_4_ * 1.9073486e-06;
      auVar58._12_4_ = auVar360._12_4_ * 1.9073486e-06;
      auVar58._16_4_ = auVar360._16_4_ * 1.9073486e-06;
      auVar58._20_4_ = auVar360._20_4_ * 1.9073486e-06;
      auVar58._24_4_ = auVar360._24_4_ * 1.9073486e-06;
      auVar58._28_4_ = auVar360._28_4_;
      auVar386 = vandps_avx(local_540,auVar383);
      auVar386 = vcmpps_avx(auVar386,auVar58,1);
      auVar310._8_4_ = 0x7f800000;
      auVar310._0_8_ = 0x7f8000007f800000;
      auVar310._12_4_ = 0x7f800000;
      auVar310._16_4_ = 0x7f800000;
      auVar310._20_4_ = 0x7f800000;
      auVar310._24_4_ = 0x7f800000;
      auVar310._28_4_ = 0x7f800000;
      _local_c80 = vblendvps_avx(auVar310,auVar56,auVar36);
      local_2a0 = fVar238 * (fVar335 + local_560._0_4_ * fVar262);
      fStack_29c = fVar256 * (fVar342 + local_560._4_4_ * fVar272);
      fStack_298 = fVar325 * (fVar343 + local_560._8_4_ * fVar273);
      fStack_294 = fVar275 * (fVar344 + local_560._12_4_ * fVar274);
      fStack_290 = fVar377 * (fVar345 + local_560._16_4_ * fVar218);
      fStack_28c = fVar277 * (fVar346 + local_560._20_4_ * fVar276);
      fStack_288 = fVar279 * (fVar347 + local_560._24_4_ * fVar278);
      fStack_284 = fVar348 + auVar360._28_4_;
      auVar267._8_4_ = 0xff800000;
      auVar267._0_8_ = 0xff800000ff800000;
      auVar267._12_4_ = 0xff800000;
      auVar267._16_4_ = 0xff800000;
      auVar267._20_4_ = 0xff800000;
      auVar267._24_4_ = 0xff800000;
      auVar267._28_4_ = 0xff800000;
      auVar407 = vblendvps_avx(auVar267,auVar57,auVar36);
      auVar360 = auVar36 & auVar386;
      if ((((((((auVar360 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar360 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar360 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar360 >> 0x7f,0) != '\0') ||
            (auVar360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar360 >> 0xbf,0) != '\0') ||
          (auVar360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar360[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar386,auVar36);
        auVar206 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar386 = vcmpps_avx(auVar111,ZEXT832(0) << 0x20,2);
        auVar385._8_4_ = 0xff800000;
        auVar385._0_8_ = 0xff800000ff800000;
        auVar385._12_4_ = 0xff800000;
        auVar385._16_4_ = 0xff800000;
        auVar385._20_4_ = 0xff800000;
        auVar385._24_4_ = 0xff800000;
        auVar385._28_4_ = 0xff800000;
        auVar409._8_4_ = 0x7f800000;
        auVar409._0_8_ = 0x7f8000007f800000;
        auVar409._12_4_ = 0x7f800000;
        auVar409._16_4_ = 0x7f800000;
        auVar409._20_4_ = 0x7f800000;
        auVar409._24_4_ = 0x7f800000;
        auVar409._28_4_ = 0x7f800000;
        auVar111 = vblendvps_avx(auVar409,auVar385,auVar386);
        auVar168 = vpmovsxwd_avx(auVar206);
        auVar206 = vpunpckhwd_avx(auVar206,auVar206);
        auVar252._16_16_ = auVar206;
        auVar252._0_16_ = auVar168;
        _local_c80 = vblendvps_avx(_local_c80,auVar111,auVar252);
        auVar111 = vblendvps_avx(auVar385,auVar409,auVar386);
        auVar407 = vblendvps_avx(auVar407,auVar111,auVar252);
        auVar111 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar152._0_4_ = auVar110._0_4_ ^ auVar111._0_4_;
        auVar152._4_4_ = auVar110._4_4_ ^ auVar111._4_4_;
        auVar152._8_4_ = auVar110._8_4_ ^ auVar111._8_4_;
        auVar152._12_4_ = auVar110._12_4_ ^ auVar111._12_4_;
        auVar152._16_4_ = auVar110._16_4_ ^ auVar111._16_4_;
        auVar152._20_4_ = auVar110._20_4_ ^ auVar111._20_4_;
        auVar152._24_4_ = auVar110._24_4_ ^ auVar111._24_4_;
        auVar152._28_4_ = auVar110._28_4_ ^ auVar111._28_4_;
        auVar110 = vorps_avx(auVar386,auVar152);
        auVar110 = vandps_avx(auVar36,auVar110);
      }
    }
    auVar313 = ZEXT3264(local_560);
    auVar111 = local_4c0 & auVar110;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0x7f,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar111 >> 0xbf,0) != '\0') ||
        (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar111[0x1f] < '\0') {
      auVar168 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      local_7c0._0_16_ = auVar168;
      auVar206 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_900._0_4_));
      auVar206 = vshufps_avx(auVar206,auVar206,0);
      auVar251._16_16_ = auVar206;
      auVar251._0_16_ = auVar206;
      auVar36 = vminps_avx(auVar251,auVar407);
      fVar218 = auVar311._28_4_ + auVar312._28_4_;
      auVar178._0_4_ =
           (float)local_860._0_4_ * fVar280 +
           (float)local_880._0_4_ * fVar357 + (float)local_840._0_4_ * fVar378;
      auVar178._4_4_ =
           (float)local_860._4_4_ * fVar293 +
           (float)local_880._4_4_ * fVar363 + (float)local_840._4_4_ * fVar388;
      auVar178._8_4_ = fStack_858 * fVar294 + fStack_878 * fVar366 + fStack_838 * fVar391;
      auVar178._12_4_ = fStack_854 * fVar296 + fStack_874 * fVar369 + fStack_834 * fVar394;
      auVar178._16_4_ = fStack_850 * fVar298 + fStack_870 * fVar371 + fStack_830 * fVar397;
      auVar178._20_4_ = fStack_84c * fVar300 + fStack_86c * fVar373 + fStack_82c * fVar400;
      auVar178._24_4_ = fStack_848 * fVar302 + fStack_868 * fVar375 + fStack_828 * fVar403;
      auVar178._28_4_ = fVar218 + fVar376 + fVar218;
      auVar111 = vrcpps_avx(auVar178);
      fVar155 = auVar111._0_4_;
      fVar158 = auVar111._4_4_;
      auVar59._4_4_ = auVar178._4_4_ * fVar158;
      auVar59._0_4_ = auVar178._0_4_ * fVar155;
      fVar376 = auVar111._8_4_;
      auVar59._8_4_ = auVar178._8_4_ * fVar376;
      fVar262 = auVar111._12_4_;
      auVar59._12_4_ = auVar178._12_4_ * fVar262;
      fVar272 = auVar111._16_4_;
      auVar59._16_4_ = auVar178._16_4_ * fVar272;
      fVar273 = auVar111._20_4_;
      auVar59._20_4_ = auVar178._20_4_ * fVar273;
      fVar274 = auVar111._24_4_;
      auVar59._24_4_ = auVar178._24_4_ * fVar274;
      auVar59._28_4_ = fVar304;
      auVar339._8_4_ = 0x3f800000;
      auVar339._0_8_ = 0x3f8000003f800000;
      auVar339._12_4_ = 0x3f800000;
      auVar339._16_4_ = 0x3f800000;
      auVar339._20_4_ = 0x3f800000;
      auVar339._24_4_ = 0x3f800000;
      auVar339._28_4_ = 0x3f800000;
      auVar311 = vsubps_avx(auVar339,auVar59);
      auVar288._8_4_ = 0x7fffffff;
      auVar288._0_8_ = 0x7fffffff7fffffff;
      auVar288._12_4_ = 0x7fffffff;
      auVar288._16_4_ = 0x7fffffff;
      auVar288._20_4_ = 0x7fffffff;
      auVar288._24_4_ = 0x7fffffff;
      auVar288._28_4_ = 0x7fffffff;
      auVar111 = vandps_avx(auVar178,auVar288);
      auVar384._8_4_ = 0x219392ef;
      auVar384._0_8_ = 0x219392ef219392ef;
      auVar384._12_4_ = 0x219392ef;
      auVar384._16_4_ = 0x219392ef;
      auVar384._20_4_ = 0x219392ef;
      auVar384._24_4_ = 0x219392ef;
      auVar384._28_4_ = 0x219392ef;
      auVar386 = vcmpps_avx(auVar111,auVar384,1);
      auVar60._4_4_ =
           (fVar158 + fVar158 * auVar311._4_4_) *
           -(fVar293 * fVar254 + fVar363 * fVar245 + fVar388 * fVar242);
      auVar60._0_4_ =
           (fVar155 + fVar155 * auVar311._0_4_) *
           -(fVar280 * fVar237 + fVar357 * fVar219 + fVar378 * fVar217);
      auVar60._8_4_ =
           (fVar376 + fVar376 * auVar311._8_4_) *
           -(fVar294 * fVar323 + fVar366 * fVar321 + fVar391 * fVar319);
      auVar60._12_4_ =
           (fVar262 + fVar262 * auVar311._12_4_) *
           -(fVar296 * fVar243 + fVar369 * fVar241 + fVar394 * fVar240);
      auVar60._16_4_ =
           (fVar272 + fVar272 * auVar311._16_4_) *
           -(fVar298 * fVar374 + fVar371 * fVar372 + fVar397 * fVar370);
      auVar60._20_4_ =
           (fVar273 + fVar273 * auVar311._20_4_) *
           -(fVar300 * fVar19 + fVar373 * fVar18 + fVar400 * fVar402);
      auVar60._24_4_ =
           (fVar274 + fVar274 * auVar311._24_4_) *
           -(fVar302 * fVar27 + fVar375 * fVar26 + fVar403 * fVar25);
      auVar60._28_4_ = -(auVar35._28_4_ + fVar218);
      auVar311 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar111 = vcmpps_avx(auVar178,auVar311,1);
      auVar111 = vorps_avx(auVar386,auVar111);
      auVar318._8_4_ = 0xff800000;
      auVar318._0_8_ = 0xff800000ff800000;
      auVar318._12_4_ = 0xff800000;
      auVar318._16_4_ = 0xff800000;
      auVar318._20_4_ = 0xff800000;
      auVar318._24_4_ = 0xff800000;
      auVar318._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar60,auVar318,auVar111);
      auVar311 = vcmpps_avx(auVar178,auVar311,6);
      auVar386 = vorps_avx(auVar386,auVar311);
      auVar351._8_4_ = 0x7f800000;
      auVar351._0_8_ = 0x7f8000007f800000;
      auVar351._12_4_ = 0x7f800000;
      auVar351._16_4_ = 0x7f800000;
      auVar351._20_4_ = 0x7f800000;
      auVar351._24_4_ = 0x7f800000;
      auVar351._28_4_ = 0x7f800000;
      auVar353 = ZEXT3264(auVar351);
      auVar386 = vblendvps_avx(auVar60,auVar351,auVar386);
      auVar311 = vmaxps_avx(local_280,_local_c80);
      auVar311 = vmaxps_avx(auVar311,auVar111);
      auVar386 = vminps_avx(auVar36,auVar386);
      auVar312 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar111 = vsubps_avx(auVar312,auVar31);
      auVar31 = vsubps_avx(auVar312,_local_a40);
      auVar61._4_4_ = auVar31._4_4_ * -fVar389;
      auVar61._0_4_ = auVar31._0_4_ * -fVar379;
      auVar61._8_4_ = auVar31._8_4_ * -fVar392;
      auVar61._12_4_ = auVar31._12_4_ * -fVar395;
      auVar61._16_4_ = auVar31._16_4_ * -fVar398;
      auVar61._20_4_ = auVar31._20_4_ * -fVar401;
      auVar61._24_4_ = auVar31._24_4_ * -fVar404;
      auVar61._28_4_ = auVar31._28_4_;
      auVar62._4_4_ = fVar255 * auVar111._4_4_;
      auVar62._0_4_ = fVar215 * auVar111._0_4_;
      auVar62._8_4_ = fVar261 * auVar111._8_4_;
      auVar62._12_4_ = fVar356 * auVar111._12_4_;
      auVar62._16_4_ = fVar365 * auVar111._16_4_;
      auVar62._20_4_ = fVar396 * auVar111._20_4_;
      auVar62._24_4_ = fVar23 * auVar111._24_4_;
      auVar62._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(auVar61,auVar62);
      auVar31 = vsubps_avx(auVar312,local_9c0);
      auVar63._4_4_ = fVar257 * auVar31._4_4_;
      auVar63._0_4_ = fVar216 * auVar31._0_4_;
      auVar63._8_4_ = fVar315 * auVar31._8_4_;
      auVar63._12_4_ = fVar362 * auVar31._12_4_;
      auVar63._16_4_ = fVar368 * auVar31._16_4_;
      auVar63._20_4_ = fVar399 * auVar31._20_4_;
      uVar8 = auVar31._28_4_;
      auVar63._24_4_ = fVar24 * auVar31._24_4_;
      auVar63._28_4_ = uVar8;
      auVar312 = vsubps_avx(auVar111,auVar63);
      auVar64._4_4_ = (float)local_840._4_4_ * -fVar389;
      auVar64._0_4_ = (float)local_840._0_4_ * -fVar379;
      auVar64._8_4_ = fStack_838 * -fVar392;
      auVar64._12_4_ = fStack_834 * -fVar395;
      auVar64._16_4_ = fStack_830 * -fVar398;
      auVar64._20_4_ = fStack_82c * -fVar401;
      auVar64._24_4_ = fStack_828 * -fVar404;
      auVar64._28_4_ = uVar92 ^ 0x80000000;
      auVar65._4_4_ = (float)local_880._4_4_ * fVar255;
      auVar65._0_4_ = (float)local_880._0_4_ * fVar215;
      auVar65._8_4_ = fStack_878 * fVar261;
      auVar65._12_4_ = fStack_874 * fVar356;
      auVar65._16_4_ = fStack_870 * fVar365;
      auVar65._20_4_ = fStack_86c * fVar396;
      auVar65._24_4_ = fStack_868 * fVar23;
      auVar65._28_4_ = uVar8;
      auVar111 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = fVar257 * (float)local_860._4_4_;
      auVar66._0_4_ = fVar216 * (float)local_860._0_4_;
      auVar66._8_4_ = fVar315 * fStack_858;
      auVar66._12_4_ = fVar362 * fStack_854;
      auVar66._16_4_ = fVar368 * fStack_850;
      auVar66._20_4_ = fVar399 * fStack_84c;
      auVar66._24_4_ = fVar24 * fStack_848;
      auVar66._28_4_ = uVar8;
      auVar313 = ZEXT864(0) << 0x20;
      auVar35 = vsubps_avx(auVar111,auVar66);
      auVar111 = vrcpps_avx(auVar35);
      fVar215 = auVar111._0_4_;
      fVar216 = auVar111._4_4_;
      auVar67._4_4_ = auVar35._4_4_ * fVar216;
      auVar67._0_4_ = auVar35._0_4_ * fVar215;
      fVar217 = auVar111._8_4_;
      auVar67._8_4_ = auVar35._8_4_ * fVar217;
      fVar219 = auVar111._12_4_;
      auVar67._12_4_ = auVar35._12_4_ * fVar219;
      fVar237 = auVar111._16_4_;
      auVar67._16_4_ = auVar35._16_4_ * fVar237;
      fVar255 = auVar111._20_4_;
      auVar67._20_4_ = auVar35._20_4_ * fVar255;
      fVar257 = auVar111._24_4_;
      auVar67._24_4_ = auVar35._24_4_ * fVar257;
      auVar67._28_4_ = fStack_844;
      auVar36 = vsubps_avx(auVar339,auVar67);
      auVar111 = vandps_avx(auVar35,auVar288);
      auVar31 = vcmpps_avx(auVar111,auVar384,1);
      auVar68._4_4_ = (fVar216 + fVar216 * auVar36._4_4_) * -auVar312._4_4_;
      auVar68._0_4_ = (fVar215 + fVar215 * auVar36._0_4_) * -auVar312._0_4_;
      auVar68._8_4_ = (fVar217 + fVar217 * auVar36._8_4_) * -auVar312._8_4_;
      auVar68._12_4_ = (fVar219 + fVar219 * auVar36._12_4_) * -auVar312._12_4_;
      auVar68._16_4_ = (fVar237 + fVar237 * auVar36._16_4_) * -auVar312._16_4_;
      auVar68._20_4_ = (fVar255 + fVar255 * auVar36._20_4_) * -auVar312._20_4_;
      auVar68._24_4_ = (fVar257 + fVar257 * auVar36._24_4_) * -auVar312._24_4_;
      auVar68._28_4_ = auVar312._28_4_ ^ 0x80000000;
      auVar111 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,1);
      auVar111 = vorps_avx(auVar31,auVar111);
      auVar111 = vblendvps_avx(auVar68,auVar318,auVar111);
      _local_7a0 = vmaxps_avx(auVar311,auVar111);
      auVar111 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,6);
      auVar111 = vorps_avx(auVar31,auVar111);
      auVar111 = vblendvps_avx(auVar68,auVar351,auVar111);
      auVar110 = vandps_avx(auVar110,local_4c0);
      local_300 = vminps_avx(auVar386,auVar111);
      auVar111 = vcmpps_avx(_local_7a0,local_300,2);
      auVar31 = auVar110 & auVar111;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0x7f,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0xbf,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar31[0x1f] < '\0') {
        auVar31 = vminps_avx(local_820,auVar112);
        auVar32 = vminps_avx(auVar32,auVar144);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar33 = vsubps_avx(auVar31,auVar33);
        auVar110 = vandps_avx(auVar111,auVar110);
        auVar111 = vminps_avx(_local_a60,auVar339);
        auVar111 = vmaxps_avx(auVar111,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar98 + fVar128 * (auVar111._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar124 + fVar153 * (auVar111._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar125 + fVar156 * (auVar111._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar126 + fVar159 * (auVar111._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar98 + fVar128 * (auVar111._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar124 + fVar153 * (auVar111._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar125 + fVar156 * (auVar111._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar126 + auVar111._28_4_ + 7.0;
        auVar86._4_4_ = fStack_29c;
        auVar86._0_4_ = local_2a0;
        auVar86._8_4_ = fStack_298;
        auVar86._12_4_ = fStack_294;
        auVar86._16_4_ = fStack_290;
        auVar86._20_4_ = fStack_28c;
        auVar86._24_4_ = fStack_288;
        auVar86._28_4_ = fStack_284;
        auVar111 = vminps_avx(auVar86,auVar339);
        auVar111 = vmaxps_avx(auVar111,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar98 + fVar128 * (auVar111._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar124 + fVar153 * (auVar111._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar125 + fVar156 * (auVar111._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar126 + fVar159 * (auVar111._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar98 + fVar128 * (auVar111._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar124 + fVar153 * (auVar111._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar125 + fVar156 * (auVar111._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar126 + auVar111._28_4_ + 7.0;
        auVar69._4_4_ = auVar33._4_4_ * 0.99999976;
        auVar69._0_4_ = auVar33._0_4_ * 0.99999976;
        auVar69._8_4_ = auVar33._8_4_ * 0.99999976;
        auVar69._12_4_ = auVar33._12_4_ * 0.99999976;
        auVar69._16_4_ = auVar33._16_4_ * 0.99999976;
        auVar69._20_4_ = auVar33._20_4_ * 0.99999976;
        auVar69._24_4_ = auVar33._24_4_ * 0.99999976;
        auVar69._28_4_ = 0x3f7ffffc;
        auVar111 = vmaxps_avx(ZEXT832(0) << 0x20,auVar69);
        auVar70._4_4_ = auVar111._4_4_ * auVar111._4_4_;
        auVar70._0_4_ = auVar111._0_4_ * auVar111._0_4_;
        auVar70._8_4_ = auVar111._8_4_ * auVar111._8_4_;
        auVar70._12_4_ = auVar111._12_4_ * auVar111._12_4_;
        auVar70._16_4_ = auVar111._16_4_ * auVar111._16_4_;
        auVar70._20_4_ = auVar111._20_4_ * auVar111._20_4_;
        auVar70._24_4_ = auVar111._24_4_ * auVar111._24_4_;
        auVar70._28_4_ = auVar111._28_4_;
        auVar33 = vsubps_avx(auVar37,auVar70);
        auVar71._4_4_ = auVar33._4_4_ * fVar161 * 4.0;
        auVar71._0_4_ = auVar33._0_4_ * fVar160 * 4.0;
        auVar71._8_4_ = auVar33._8_4_ * fVar162 * 4.0;
        auVar71._12_4_ = auVar33._12_4_ * fVar163 * 4.0;
        auVar71._16_4_ = auVar33._16_4_ * fVar327 * 4.0;
        auVar71._20_4_ = auVar33._20_4_ * fVar330 * 4.0;
        auVar71._24_4_ = auVar33._24_4_ * fVar333 * 4.0;
        auVar71._28_4_ = auVar111._28_4_;
        auVar352 = vsubps_avx(auVar54,auVar71);
        auVar111 = vcmpps_avx(auVar352,ZEXT832(0) << 0x20,5);
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0x7f,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar111 >> 0xbf,0) == '\0') &&
            (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar111[0x1f]) {
          auVar144 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8c0 = ZEXT832(0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          auVar209 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar231 = ZEXT828(0) << 0x20;
          auVar268._8_4_ = 0x7f800000;
          auVar268._0_8_ = 0x7f8000007f800000;
          auVar268._12_4_ = 0x7f800000;
          auVar268._16_4_ = 0x7f800000;
          auVar268._20_4_ = 0x7f800000;
          auVar268._24_4_ = 0x7f800000;
          auVar268._28_4_ = 0x7f800000;
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
          _local_8a0 = _local_8c0;
        }
        else {
          auVar32 = vsqrtps_avx(auVar352);
          auVar212._0_4_ = fVar160 + fVar160;
          auVar212._4_4_ = fVar161 + fVar161;
          auVar212._8_4_ = fVar162 + fVar162;
          auVar212._12_4_ = fVar163 + fVar163;
          auVar212._16_4_ = fVar327 + fVar327;
          auVar212._20_4_ = fVar330 + fVar330;
          auVar212._24_4_ = fVar333 + fVar333;
          auVar212._28_4_ = fVar129 + fVar129;
          auVar31 = vrcpps_avx(auVar212);
          fVar129 = auVar31._0_4_;
          fVar215 = auVar31._4_4_;
          auVar72._4_4_ = auVar212._4_4_ * fVar215;
          auVar72._0_4_ = auVar212._0_4_ * fVar129;
          fVar216 = auVar31._8_4_;
          auVar72._8_4_ = auVar212._8_4_ * fVar216;
          fVar217 = auVar31._12_4_;
          auVar72._12_4_ = auVar212._12_4_ * fVar217;
          fVar219 = auVar31._16_4_;
          auVar72._16_4_ = auVar212._16_4_ * fVar219;
          fVar237 = auVar31._20_4_;
          auVar72._20_4_ = auVar212._20_4_ * fVar237;
          fVar255 = auVar31._24_4_;
          auVar72._24_4_ = auVar212._24_4_ * fVar255;
          auVar72._28_4_ = auVar212._28_4_;
          auVar144 = vsubps_avx(auVar339,auVar72);
          fVar129 = fVar129 + fVar129 * auVar144._0_4_;
          fVar215 = fVar215 + fVar215 * auVar144._4_4_;
          fVar216 = fVar216 + fVar216 * auVar144._8_4_;
          fVar217 = fVar217 + fVar217 * auVar144._12_4_;
          fVar219 = fVar219 + fVar219 * auVar144._16_4_;
          fVar237 = fVar237 + fVar237 * auVar144._20_4_;
          fVar255 = fVar255 + fVar255 * auVar144._24_4_;
          fVar257 = auVar31._28_4_ + auVar144._28_4_;
          auVar233._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
          auVar233._8_4_ = -local_aa0._8_4_;
          auVar233._12_4_ = -local_aa0._12_4_;
          auVar233._16_4_ = -local_aa0._16_4_;
          auVar233._20_4_ = -local_aa0._20_4_;
          auVar233._24_4_ = -local_aa0._24_4_;
          auVar233._28_4_ = -local_aa0._28_4_;
          auVar31 = vsubps_avx(auVar233,auVar32);
          fVar323 = auVar31._0_4_ * fVar129;
          fVar356 = auVar31._4_4_ * fVar215;
          auVar73._4_4_ = fVar356;
          auVar73._0_4_ = fVar323;
          fVar362 = auVar31._8_4_ * fVar216;
          auVar73._8_4_ = fVar362;
          fVar240 = auVar31._12_4_ * fVar217;
          auVar73._12_4_ = fVar240;
          fVar241 = auVar31._16_4_ * fVar219;
          auVar73._16_4_ = fVar241;
          fVar243 = auVar31._20_4_ * fVar237;
          auVar73._20_4_ = fVar243;
          fVar365 = auVar31._24_4_ * fVar255;
          auVar73._24_4_ = fVar365;
          auVar73._28_4_ = 0x219392ef;
          auVar32 = vsubps_avx(auVar32,local_aa0);
          fVar129 = auVar32._0_4_ * fVar129;
          fVar215 = auVar32._4_4_ * fVar215;
          auVar74._4_4_ = fVar215;
          auVar74._0_4_ = fVar129;
          fVar216 = auVar32._8_4_ * fVar216;
          auVar74._8_4_ = fVar216;
          fVar217 = auVar32._12_4_ * fVar217;
          auVar74._12_4_ = fVar217;
          fVar219 = auVar32._16_4_ * fVar219;
          auVar74._16_4_ = fVar219;
          fVar237 = auVar32._20_4_ * fVar237;
          auVar74._20_4_ = fVar237;
          fVar255 = auVar32._24_4_ * fVar255;
          auVar74._24_4_ = fVar255;
          auVar74._28_4_ = fVar367;
          fVar242 = fVar238 * (fVar323 * local_560._0_4_ + fVar335);
          fVar245 = fVar256 * (fVar356 * local_560._4_4_ + fVar342);
          fVar254 = fVar325 * (fVar362 * local_560._8_4_ + fVar343);
          fVar261 = fVar275 * (fVar240 * local_560._12_4_ + fVar344);
          fVar315 = fVar377 * (fVar241 * local_560._16_4_ + fVar345);
          fVar319 = fVar277 * (fVar243 * local_560._20_4_ + fVar346);
          fVar321 = fVar279 * (fVar365 * local_560._24_4_ + fVar347);
          auStack_770._12_4_ = auVar34._28_4_;
          auVar145._0_4_ = local_960 + fVar194 * fVar242;
          auVar145._4_4_ = fStack_95c + fVar253 * fVar245;
          auVar145._8_4_ = fStack_958 + fVar260 * fVar254;
          auVar145._12_4_ = fStack_954 + fVar354 * fVar261;
          auVar145._16_4_ = fStack_950 + fVar364 * fVar315;
          auVar145._20_4_ = fStack_94c + fVar393 * fVar319;
          auVar145._24_4_ = fStack_948 + fVar22 * fVar321;
          auVar145._28_4_ = fStack_944 + auVar32._28_4_ + fVar348;
          auVar75._4_4_ = (float)local_860._4_4_ * fVar356;
          auVar75._0_4_ = (float)local_860._0_4_ * fVar323;
          auVar75._8_4_ = fStack_858 * fVar362;
          auVar75._12_4_ = fStack_854 * fVar240;
          auVar75._16_4_ = fStack_850 * fVar241;
          auVar75._20_4_ = fStack_84c * fVar243;
          auVar75._24_4_ = fStack_848 * fVar365;
          auVar75._28_4_ = fVar257;
          auVar144 = vsubps_avx(auVar75,auVar145);
          auVar213._0_4_ = fVar316 + fVar154 * fVar242;
          auVar213._4_4_ = fVar320 + fVar239 * fVar245;
          auVar213._8_4_ = fVar322 + fVar258 * fVar254;
          auVar213._12_4_ = fVar324 + fVar328 * fVar261;
          auVar213._16_4_ = fVar326 + fVar355 * fVar315;
          auVar213._20_4_ = fVar329 + fVar387 * fVar319;
          auVar213._24_4_ = fVar332 + fVar20 * fVar321;
          auVar213._28_4_ = fVar334 + fVar257;
          auVar269._0_4_ = (float)local_880._0_4_ * fVar323;
          auVar269._4_4_ = (float)local_880._4_4_ * fVar356;
          auVar269._8_4_ = fStack_878 * fVar362;
          auVar269._12_4_ = fStack_874 * fVar240;
          auVar269._16_4_ = fStack_870 * fVar241;
          auVar269._20_4_ = fStack_86c * fVar243;
          auVar269._24_4_ = fStack_868 * fVar365;
          auVar269._28_4_ = 0;
          _local_a40 = vsubps_avx(auVar269,auVar213);
          auVar234._0_4_ = fVar164 + fVar157 * fVar242;
          auVar234._4_4_ = fVar187 + fVar244 * fVar245;
          auVar234._8_4_ = fVar188 + fVar259 * fVar254;
          auVar234._12_4_ = fVar189 + fVar331 * fVar261;
          auVar234._16_4_ = fVar190 + fVar361 * fVar315;
          auVar234._20_4_ = fVar191 + fVar390 * fVar319;
          auVar234._24_4_ = fVar192 + fVar21 * fVar321;
          auVar234._28_4_ = fVar193 + auVar31._28_4_;
          auVar76._4_4_ = (float)local_840._4_4_ * fVar356;
          auVar76._0_4_ = (float)local_840._0_4_ * fVar323;
          auVar76._8_4_ = fStack_838 * fVar362;
          auVar76._12_4_ = fStack_834 * fVar240;
          auVar76._16_4_ = fStack_830 * fVar241;
          auVar76._20_4_ = fStack_82c * fVar243;
          auVar76._24_4_ = fStack_828 * fVar365;
          auVar76._28_4_ = 0;
          auVar31 = vsubps_avx(auVar76,auVar234);
          auVar231 = auVar31._0_28_;
          fVar238 = fVar238 * (fVar129 * local_560._0_4_ + fVar335);
          fVar256 = fVar256 * (fVar215 * local_560._4_4_ + fVar342);
          fVar325 = fVar325 * (fVar216 * local_560._8_4_ + fVar343);
          fVar275 = fVar275 * (fVar217 * local_560._12_4_ + fVar344);
          fVar377 = fVar377 * (fVar219 * local_560._16_4_ + fVar345);
          fVar277 = fVar277 * (fVar237 * local_560._20_4_ + fVar346);
          fVar279 = fVar279 * (fVar255 * local_560._24_4_ + fVar347);
          auVar290._0_4_ = local_960 + fVar194 * fVar238;
          auVar290._4_4_ = fStack_95c + fVar253 * fVar256;
          auVar290._8_4_ = fStack_958 + fVar260 * fVar325;
          auVar290._12_4_ = fStack_954 + fVar354 * fVar275;
          auVar290._16_4_ = fStack_950 + fVar364 * fVar377;
          auVar290._20_4_ = fStack_94c + fVar393 * fVar277;
          auVar290._24_4_ = fStack_948 + fVar22 * fVar279;
          auVar290._28_4_ = fStack_944 + (float)auStack_770._12_4_;
          auVar77._4_4_ = (float)local_860._4_4_ * fVar215;
          auVar77._0_4_ = (float)local_860._0_4_ * fVar129;
          auVar77._8_4_ = fStack_858 * fVar216;
          auVar77._12_4_ = fStack_854 * fVar217;
          auVar77._16_4_ = fStack_850 * fVar219;
          auVar77._20_4_ = fStack_84c * fVar237;
          auVar77._24_4_ = fStack_848 * fVar255;
          auVar77._28_4_ = fStack_844;
          _local_8a0 = vsubps_avx(auVar77,auVar290);
          auVar291._0_4_ = fVar316 + fVar154 * fVar238;
          auVar291._4_4_ = fVar320 + fVar239 * fVar256;
          auVar291._8_4_ = fVar322 + fVar258 * fVar325;
          auVar291._12_4_ = fVar324 + fVar328 * fVar275;
          auVar291._16_4_ = fVar326 + fVar355 * fVar377;
          auVar291._20_4_ = fVar329 + fVar387 * fVar277;
          auVar291._24_4_ = fVar332 + fVar20 * fVar279;
          auVar291._28_4_ = fVar334 + local_8a0._28_4_;
          auVar78._4_4_ = (float)local_880._4_4_ * fVar215;
          auVar78._0_4_ = (float)local_880._0_4_ * fVar129;
          auVar78._8_4_ = fStack_878 * fVar216;
          auVar78._12_4_ = fStack_874 * fVar217;
          auVar78._16_4_ = fStack_870 * fVar219;
          auVar78._20_4_ = fStack_86c * fVar237;
          auVar78._24_4_ = fStack_868 * fVar255;
          auVar78._28_4_ = fStack_844;
          _local_8c0 = vsubps_avx(auVar78,auVar291);
          auVar270._0_4_ = fVar164 + fVar157 * fVar238;
          auVar270._4_4_ = fVar187 + fVar244 * fVar256;
          auVar270._8_4_ = fVar188 + fVar259 * fVar325;
          auVar270._12_4_ = fVar189 + fVar331 * fVar275;
          auVar270._16_4_ = fVar190 + fVar361 * fVar377;
          auVar270._20_4_ = fVar191 + fVar390 * fVar277;
          auVar270._24_4_ = fVar192 + fVar21 * fVar279;
          auVar270._28_4_ = fVar193 + fVar348 + 0.0;
          auVar79._4_4_ = (float)local_840._4_4_ * fVar215;
          auVar79._0_4_ = (float)local_840._0_4_ * fVar129;
          auVar79._8_4_ = fStack_838 * fVar216;
          auVar79._12_4_ = fStack_834 * fVar217;
          auVar79._16_4_ = fStack_830 * fVar219;
          auVar79._20_4_ = fStack_82c * fVar237;
          auVar79._24_4_ = fStack_828 * fVar255;
          auVar79._28_4_ = local_8c0._28_4_;
          _local_8e0 = vsubps_avx(auVar79,auVar270);
          auVar32 = vcmpps_avx(auVar352,_DAT_01faff00,5);
          auVar271._8_4_ = 0x7f800000;
          auVar271._0_8_ = 0x7f8000007f800000;
          auVar271._12_4_ = 0x7f800000;
          auVar271._16_4_ = 0x7f800000;
          auVar271._20_4_ = 0x7f800000;
          auVar271._24_4_ = 0x7f800000;
          auVar271._28_4_ = 0x7f800000;
          auVar268 = vblendvps_avx(auVar271,auVar73,auVar32);
          auVar340._8_4_ = 0x7fffffff;
          auVar340._0_8_ = 0x7fffffff7fffffff;
          auVar340._12_4_ = 0x7fffffff;
          auVar340._16_4_ = 0x7fffffff;
          auVar340._20_4_ = 0x7fffffff;
          auVar340._24_4_ = 0x7fffffff;
          auVar340._28_4_ = 0x7fffffff;
          auVar31 = vandps_avx(auVar340,local_2e0);
          auVar31 = vmaxps_avx(local_4e0,auVar31);
          auVar352._8_4_ = 0x36000000;
          auVar352._0_8_ = 0x3600000036000000;
          auVar352._12_4_ = 0x36000000;
          auVar352._16_4_ = 0x36000000;
          auVar352._20_4_ = 0x36000000;
          auVar352._24_4_ = 0x36000000;
          auVar352._28_4_ = 0x36000000;
          auVar80._4_4_ = auVar31._4_4_ * 1.9073486e-06;
          auVar80._0_4_ = auVar31._0_4_ * 1.9073486e-06;
          auVar80._8_4_ = auVar31._8_4_ * 1.9073486e-06;
          auVar80._12_4_ = auVar31._12_4_ * 1.9073486e-06;
          auVar80._16_4_ = auVar31._16_4_ * 1.9073486e-06;
          auVar80._20_4_ = auVar31._20_4_ * 1.9073486e-06;
          auVar80._24_4_ = auVar31._24_4_ * 1.9073486e-06;
          auVar80._28_4_ = auVar31._28_4_;
          auVar31 = vandps_avx(auVar340,local_540);
          auVar31 = vcmpps_avx(auVar31,auVar80,1);
          auVar292._8_4_ = 0xff800000;
          auVar292._0_8_ = 0xff800000ff800000;
          auVar292._12_4_ = 0xff800000;
          auVar292._16_4_ = 0xff800000;
          auVar292._20_4_ = 0xff800000;
          auVar292._24_4_ = 0xff800000;
          auVar292._28_4_ = 0xff800000;
          auVar289 = vblendvps_avx(auVar292,auVar74,auVar32);
          auVar386 = auVar32 & auVar31;
          if ((((((((auVar386 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar386 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar386 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar386 >> 0x7f,0) != '\0') ||
                (auVar386 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar386 >> 0xbf,0) != '\0') ||
              (auVar386 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar386[0x1f] < '\0') {
            auVar111 = vandps_avx(auVar31,auVar32);
            auVar206 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
            auVar386 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar31 = vcmpps_avx(auVar33,auVar386,2);
            auVar408._8_4_ = 0xff800000;
            auVar408._0_8_ = 0xff800000ff800000;
            auVar408._12_4_ = 0xff800000;
            auVar408._16_4_ = 0xff800000;
            auVar408._20_4_ = 0xff800000;
            auVar408._24_4_ = 0xff800000;
            auVar408._28_4_ = 0xff800000;
            auVar410._8_4_ = 0x7f800000;
            auVar410._0_8_ = 0x7f8000007f800000;
            auVar410._12_4_ = 0x7f800000;
            auVar410._16_4_ = 0x7f800000;
            auVar410._20_4_ = 0x7f800000;
            auVar410._24_4_ = 0x7f800000;
            auVar410._28_4_ = 0x7f800000;
            auVar33 = vblendvps_avx(auVar410,auVar408,auVar31);
            auVar172 = vpmovsxwd_avx(auVar206);
            auVar206 = vpunpckhwd_avx(auVar206,auVar206);
            auVar341._16_16_ = auVar206;
            auVar341._0_16_ = auVar172;
            auVar268 = vblendvps_avx(auVar268,auVar33,auVar341);
            auVar352 = vblendvps_avx(auVar408,auVar410,auVar31);
            auVar289 = vblendvps_avx(auVar289,auVar352,auVar341);
            auVar33 = vcmpps_avx(auVar386,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar123._0_4_ = auVar33._0_4_ ^ auVar111._0_4_;
            auVar123._4_4_ = auVar33._4_4_ ^ auVar111._4_4_;
            auVar123._8_4_ = auVar33._8_4_ ^ auVar111._8_4_;
            auVar123._12_4_ = auVar33._12_4_ ^ auVar111._12_4_;
            auVar123._16_4_ = auVar33._16_4_ ^ auVar111._16_4_;
            auVar123._20_4_ = auVar33._20_4_ ^ auVar111._20_4_;
            auVar123._24_4_ = auVar33._24_4_ ^ auVar111._24_4_;
            auVar123._28_4_ = auVar33._28_4_ ^ auVar111._28_4_;
            auVar111 = vorps_avx(auVar31,auVar123);
            auVar111 = vandps_avx(auVar32,auVar111);
          }
          auVar209 = local_a40._0_28_;
        }
        auVar353 = ZEXT3264(auVar352);
        _local_360 = _local_7a0;
        local_340 = vminps_avx(local_300,auVar268);
        local_320 = vmaxps_avx(_local_7a0,auVar289);
        auVar33 = vcmpps_avx(_local_7a0,local_340,2);
        local_700 = vandps_avx(auVar33,auVar110);
        auVar33 = vcmpps_avx(local_320,local_300,2);
        local_7e0 = vandps_avx(auVar33,auVar110);
        auVar110 = vorps_avx(local_7e0,local_700);
        auVar313 = ZEXT1664(auVar168);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar110[0x1f] < '\0') {
          _local_a60 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_740._0_4_ = auVar111._0_4_ ^ local_a60._0_4_;
          local_740._4_4_ = auVar111._4_4_ ^ local_a60._4_4_;
          local_740._8_4_ = auVar111._8_4_ ^ local_a60._8_4_;
          local_740._12_4_ = auVar111._12_4_ ^ local_a60._12_4_;
          local_740._16_4_ = auVar111._16_4_ ^ local_a60._16_4_;
          local_740._20_4_ = auVar111._20_4_ ^ local_a60._20_4_;
          local_740._24_4_ = auVar111._24_4_ ^ local_a60._24_4_;
          local_740._28_4_ = (uint)auVar111._28_4_ ^ (uint)local_a60._28_4_;
          auVar113._0_4_ =
               auVar144._0_4_ * (float)local_860._0_4_ +
               auVar209._0_4_ * (float)local_880._0_4_ + (float)local_840._0_4_ * auVar231._0_4_;
          auVar113._4_4_ =
               auVar144._4_4_ * (float)local_860._4_4_ +
               auVar209._4_4_ * (float)local_880._4_4_ + (float)local_840._4_4_ * auVar231._4_4_;
          auVar113._8_4_ =
               auVar144._8_4_ * fStack_858 +
               auVar209._8_4_ * fStack_878 + fStack_838 * auVar231._8_4_;
          auVar113._12_4_ =
               auVar144._12_4_ * fStack_854 +
               auVar209._12_4_ * fStack_874 + fStack_834 * auVar231._12_4_;
          auVar113._16_4_ =
               auVar144._16_4_ * fStack_850 +
               auVar209._16_4_ * fStack_870 + fStack_830 * auVar231._16_4_;
          auVar113._20_4_ =
               auVar144._20_4_ * fStack_84c +
               auVar209._20_4_ * fStack_86c + fStack_82c * auVar231._20_4_;
          auVar113._24_4_ =
               auVar144._24_4_ * fStack_848 +
               auVar209._24_4_ * fStack_868 + fStack_828 * auVar231._24_4_;
          auVar113._28_4_ = auVar111._28_4_ + auVar144._28_4_ + local_a60._28_4_;
          auVar146._8_4_ = 0x7fffffff;
          auVar146._0_8_ = 0x7fffffff7fffffff;
          auVar146._12_4_ = 0x7fffffff;
          auVar146._16_4_ = 0x7fffffff;
          auVar146._20_4_ = 0x7fffffff;
          auVar146._24_4_ = 0x7fffffff;
          auVar146._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar113,auVar146);
          auVar147._8_4_ = 0x3e99999a;
          auVar147._0_8_ = 0x3e99999a3e99999a;
          auVar147._12_4_ = 0x3e99999a;
          auVar147._16_4_ = 0x3e99999a;
          auVar147._20_4_ = 0x3e99999a;
          auVar147._24_4_ = 0x3e99999a;
          auVar147._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar147,1);
          auVar110 = vorps_avx(auVar110,local_740);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar179._8_4_ = 2;
          auVar179._0_8_ = 0x200000002;
          auVar179._12_4_ = 2;
          auVar179._16_4_ = 2;
          auVar179._20_4_ = 2;
          auVar179._24_4_ = 2;
          auVar179._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar179,auVar148,auVar110);
          local_760 = ZEXT432(local_cc4);
          local_780 = vpshufd_avx(ZEXT416(local_cc4),0);
          auVar206 = vpcmpgtd_avx(auVar110._16_16_,local_780);
          auStack_770 = auVar34._16_16_;
          auVar172 = vpcmpgtd_avx(auVar110._0_16_,local_780);
          auVar149._16_16_ = auVar206;
          auVar149._0_16_ = auVar172;
          local_720 = vblendps_avx(ZEXT1632(auVar172),auVar149,0xf0);
          local_6c0 = vandnps_avx(local_720,local_700);
          auVar313 = ZEXT3264(local_6c0);
          auVar110 = local_700 & ~local_720;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0x7f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0xbf,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar110[0x1f]) {
            auVar206 = vshufps_avx(auVar168,auVar168,0);
            auVar114._16_16_ = auVar206;
            auVar114._0_16_ = auVar206;
            auVar231 = local_860._0_28_;
            auVar110 = local_320;
          }
          else {
            local_980._4_4_ = (float)local_7a0._4_4_ + (float)local_920._4_4_;
            local_980._0_4_ = (float)local_7a0._0_4_ + (float)local_920._0_4_;
            fStack_978 = fStack_798 + fStack_918;
            fStack_974 = fStack_794 + fStack_914;
            fStack_970 = fStack_790 + fStack_910;
            fStack_96c = fStack_78c + fStack_90c;
            fStack_968 = fStack_788 + fStack_908;
            fStack_964 = fStack_784 + fStack_904;
            local_7c0 = local_320;
            do {
              auVar115._8_4_ = 0x7f800000;
              auVar115._0_8_ = 0x7f8000007f800000;
              auVar115._12_4_ = 0x7f800000;
              auVar115._16_4_ = 0x7f800000;
              auVar115._20_4_ = 0x7f800000;
              auVar115._24_4_ = 0x7f800000;
              auVar115._28_4_ = 0x7f800000;
              auVar110 = auVar313._0_32_;
              auVar111 = vblendvps_avx(auVar115,_local_7a0,auVar110);
              auVar33 = vshufps_avx(auVar111,auVar111,0xb1);
              auVar33 = vminps_avx(auVar111,auVar33);
              auVar31 = vshufpd_avx(auVar33,auVar33,5);
              auVar33 = vminps_avx(auVar33,auVar31);
              auVar31 = vperm2f128_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar33,auVar31);
              auVar111 = vcmpps_avx(auVar111,auVar33,0);
              auVar33 = auVar110 & auVar111;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar111,auVar110);
              }
              uVar89 = vmovmskps_avx(auVar110);
              uVar92 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar90 = (ulong)uVar92;
              *(undefined4 *)(local_6c0 + uVar90 * 4) = 0;
              fVar129 = local_1a0[uVar90];
              uVar92 = *(uint *)(local_360 + uVar90 * 4);
              fVar154 = auVar134._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar154 = sqrtf((float)local_9a0._0_4_);
              }
              auVar168 = vminps_avx(_local_ae0,_local_b00);
              auVar206 = vmaxps_avx(_local_ae0,_local_b00);
              auVar172 = vminps_avx(_local_af0,_local_b10);
              auVar105 = vminps_avx(auVar168,auVar172);
              auVar168 = vmaxps_avx(_local_af0,_local_b10);
              auVar172 = vmaxps_avx(auVar206,auVar168);
              auVar198._8_4_ = 0x7fffffff;
              auVar198._0_8_ = 0x7fffffff7fffffff;
              auVar198._12_4_ = 0x7fffffff;
              auVar206 = vandps_avx(auVar105,auVar198);
              auVar168 = vandps_avx(auVar172,auVar198);
              auVar206 = vmaxps_avx(auVar206,auVar168);
              auVar168 = vmovshdup_avx(auVar206);
              auVar168 = vmaxss_avx(auVar168,auVar206);
              auVar206 = vshufpd_avx(auVar206,auVar206,1);
              auVar206 = vmaxss_avx(auVar206,auVar168);
              local_960 = auVar206._0_4_ * 1.9073486e-06;
              local_9e0._0_4_ = fVar154 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar172,auVar172,0xff);
              auVar206 = vinsertps_avx(ZEXT416(uVar92),ZEXT416((uint)fVar129),0x10);
              auVar353 = ZEXT1664(auVar206);
              lVar97 = 5;
              do {
                auVar350 = auVar353._0_16_;
                auVar206 = vshufps_avx(auVar350,auVar350,0);
                auVar102._0_4_ = auVar206._0_4_ * (float)local_990._0_4_ + 0.0;
                auVar102._4_4_ = auVar206._4_4_ * (float)local_990._4_4_ + 0.0;
                auVar102._8_4_ = auVar206._8_4_ * fStack_988 + 0.0;
                auVar102._12_4_ = auVar206._12_4_ * fStack_984 + 0.0;
                auVar206 = vmovshdup_avx(auVar350);
                fVar216 = auVar206._0_4_;
                fVar194 = 1.0 - fVar216;
                fVar154 = fVar216 * fVar216;
                fVar157 = fVar216 * 3.0;
                fVar129 = fVar157 + -5.0;
                auVar206 = ZEXT416((uint)(fVar216 * fVar216 * -fVar194 * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar168 = ZEXT416((uint)((fVar194 * fVar194 * (fVar194 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar168 = vshufps_avx(auVar168,auVar168,0);
                auVar172 = ZEXT416((uint)((fVar154 * fVar129 + 2.0) * 0.5));
                auVar172 = vshufps_avx(auVar172,auVar172,0);
                auVar105 = ZEXT416((uint)(fVar194 * fVar194 * -fVar216 * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar169._0_4_ =
                     auVar105._0_4_ * (float)local_ae0._0_4_ +
                     auVar172._0_4_ * (float)local_b00._0_4_ +
                     auVar168._0_4_ * (float)local_af0._0_4_ +
                     auVar206._0_4_ * (float)local_b10._0_4_;
                auVar169._4_4_ =
                     auVar105._4_4_ * (float)local_ae0._4_4_ +
                     auVar172._4_4_ * (float)local_b00._4_4_ +
                     auVar168._4_4_ * (float)local_af0._4_4_ +
                     auVar206._4_4_ * (float)local_b10._4_4_;
                auVar169._8_4_ =
                     auVar105._8_4_ * fStack_ad8 +
                     auVar172._8_4_ * fStack_af8 +
                     auVar168._8_4_ * fStack_ae8 + auVar206._8_4_ * fStack_b08;
                auVar169._12_4_ =
                     auVar105._12_4_ * fStack_ad4 +
                     auVar172._12_4_ * fStack_af4 +
                     auVar168._12_4_ * fStack_ae4 + auVar206._12_4_ * fStack_b04;
                _local_a40 = auVar169;
                auVar168 = vsubps_avx(auVar102,auVar169);
                auVar206 = vdpps_avx(auVar168,auVar168,0x7f);
                fVar215 = auVar206._0_4_;
                if (fVar215 < 0.0) {
                  local_9c0._0_4_ = fVar154;
                  local_a00._0_4_ = fVar157;
                  local_aa0._0_4_ = fVar216 * 9.0;
                  local_a20._0_4_ = fVar129;
                  local_800._0_4_ = fVar194 * -2.0;
                  fVar217 = sqrtf(fVar215);
                  fVar237 = (float)local_aa0._0_4_;
                  fVar219 = (float)local_800._0_4_;
                  fVar154 = (float)local_a00._0_4_;
                  fVar129 = (float)local_a20._0_4_;
                }
                else {
                  auVar172 = vsqrtss_avx(auVar206,auVar206);
                  fVar217 = auVar172._0_4_;
                  fVar237 = fVar216 * 9.0;
                  fVar219 = fVar194 * -2.0;
                  local_9c0._0_4_ = fVar154;
                  fVar154 = fVar157;
                }
                auVar172 = ZEXT416((uint)(((float)local_9c0._0_4_ + fVar216 * fVar219) * 0.5));
                auVar172 = vshufps_avx(auVar172,auVar172,0);
                auVar105 = ZEXT416((uint)(((fVar194 + fVar194) * (fVar154 + 2.0) +
                                          fVar194 * fVar194 * -3.0) * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar174 = ZEXT416((uint)((fVar129 * (fVar216 + fVar216) + fVar216 * fVar154) * 0.5)
                                  );
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar139 = ZEXT416((uint)((fVar216 * (fVar194 + fVar194) - fVar194 * fVar194) * 0.5)
                                  );
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar337._0_4_ =
                     (float)local_ae0._0_4_ * auVar139._0_4_ +
                     (float)local_b00._0_4_ * auVar174._0_4_ +
                     (float)local_b10._0_4_ * auVar172._0_4_ +
                     (float)local_af0._0_4_ * auVar105._0_4_;
                auVar337._4_4_ =
                     (float)local_ae0._4_4_ * auVar139._4_4_ +
                     (float)local_b00._4_4_ * auVar174._4_4_ +
                     (float)local_b10._4_4_ * auVar172._4_4_ +
                     (float)local_af0._4_4_ * auVar105._4_4_;
                auVar337._8_4_ =
                     fStack_ad8 * auVar139._8_4_ +
                     fStack_af8 * auVar174._8_4_ +
                     fStack_b08 * auVar172._8_4_ + fStack_ae8 * auVar105._8_4_;
                auVar337._12_4_ =
                     fStack_ad4 * auVar139._12_4_ +
                     fStack_af4 * auVar174._12_4_ +
                     fStack_b04 * auVar172._12_4_ + fStack_ae4 * auVar105._12_4_;
                auVar139 = vpermilps_avx(ZEXT416((uint)(fVar157 + -1.0)),0);
                auVar30 = vpermilps_avx(ZEXT416((uint)(fVar216 * -9.0 + 4.0)),0);
                auVar172 = vshufps_avx(ZEXT416((uint)(fVar237 + -5.0)),
                                       ZEXT416((uint)(fVar237 + -5.0)),0);
                auVar105 = ZEXT416((uint)(fVar216 * -3.0 + 2.0));
                auVar174 = vshufps_avx(auVar105,auVar105,0);
                auVar105 = vdpps_avx(auVar337,auVar337,0x7f);
                auVar135._0_4_ =
                     (float)local_ae0._0_4_ * auVar174._0_4_ +
                     (float)local_b00._0_4_ * auVar172._0_4_ +
                     (float)local_af0._0_4_ * auVar30._0_4_ +
                     (float)local_b10._0_4_ * auVar139._0_4_;
                auVar135._4_4_ =
                     (float)local_ae0._4_4_ * auVar174._4_4_ +
                     (float)local_b00._4_4_ * auVar172._4_4_ +
                     (float)local_af0._4_4_ * auVar30._4_4_ +
                     (float)local_b10._4_4_ * auVar139._4_4_;
                auVar135._8_4_ =
                     fStack_ad8 * auVar174._8_4_ +
                     fStack_af8 * auVar172._8_4_ +
                     fStack_ae8 * auVar30._8_4_ + fStack_b08 * auVar139._8_4_;
                auVar135._12_4_ =
                     fStack_ad4 * auVar174._12_4_ +
                     fStack_af4 * auVar172._12_4_ +
                     fStack_ae4 * auVar30._12_4_ + fStack_b04 * auVar139._12_4_;
                auVar172 = vblendps_avx(auVar105,_DAT_01f7aa10,0xe);
                auVar174 = vrsqrtss_avx(auVar172,auVar172);
                fVar154 = auVar174._0_4_;
                fVar129 = auVar105._0_4_;
                auVar174 = vdpps_avx(auVar337,auVar135,0x7f);
                auVar139 = vshufps_avx(auVar105,auVar105,0);
                auVar136._0_4_ = auVar135._0_4_ * auVar139._0_4_;
                auVar136._4_4_ = auVar135._4_4_ * auVar139._4_4_;
                auVar136._8_4_ = auVar135._8_4_ * auVar139._8_4_;
                auVar136._12_4_ = auVar135._12_4_ * auVar139._12_4_;
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar223._0_4_ = auVar337._0_4_ * auVar174._0_4_;
                auVar223._4_4_ = auVar337._4_4_ * auVar174._4_4_;
                auVar223._8_4_ = auVar337._8_4_ * auVar174._8_4_;
                auVar223._12_4_ = auVar337._12_4_ * auVar174._12_4_;
                auVar30 = vsubps_avx(auVar136,auVar223);
                auVar174 = vrcpss_avx(auVar172,auVar172);
                auVar172 = vmaxss_avx(ZEXT416((uint)local_960),
                                      ZEXT416((uint)(auVar353._0_4_ * (float)local_9e0._0_4_)));
                auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - fVar129 * auVar174._0_4_)));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                uVar90 = CONCAT44(auVar337._4_4_,auVar337._0_4_);
                auVar286._0_8_ = uVar90 ^ 0x8000000080000000;
                auVar286._8_4_ = -auVar337._8_4_;
                auVar286._12_4_ = -auVar337._12_4_;
                auVar139 = ZEXT416((uint)(fVar154 * 1.5 +
                                         fVar129 * -0.5 * fVar154 * fVar154 * fVar154));
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar199._0_4_ = auVar139._0_4_ * auVar30._0_4_ * auVar174._0_4_;
                auVar199._4_4_ = auVar139._4_4_ * auVar30._4_4_ * auVar174._4_4_;
                auVar199._8_4_ = auVar139._8_4_ * auVar30._8_4_ * auVar174._8_4_;
                auVar199._12_4_ = auVar139._12_4_ * auVar30._12_4_ * auVar174._12_4_;
                local_9c0._0_4_ = auVar337._0_4_ * auVar139._0_4_;
                local_9c0._4_4_ = auVar337._4_4_ * auVar139._4_4_;
                local_9c0._8_4_ = auVar337._8_4_ * auVar139._8_4_;
                local_9c0._12_4_ = auVar337._12_4_ * auVar139._12_4_;
                if (fVar129 < 0.0) {
                  fVar129 = sqrtf(fVar129);
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                  fVar129 = auVar105._0_4_;
                }
                auVar105 = vdpps_avx(auVar168,local_9c0._0_16_,0x7f);
                fVar129 = (local_960 / fVar129) * (fVar217 + 1.0) +
                          auVar172._0_4_ + fVar217 * local_960;
                auVar174 = vdpps_avx(auVar286,local_9c0._0_16_,0x7f);
                auVar139 = vdpps_avx(auVar168,auVar199,0x7f);
                auVar30 = vdpps_avx(_local_990,local_9c0._0_16_,0x7f);
                auVar99 = vdpps_avx(auVar168,auVar286,0x7f);
                fVar154 = auVar174._0_4_ + auVar139._0_4_;
                fVar157 = auVar105._0_4_;
                auVar103._0_4_ = fVar157 * fVar157;
                auVar103._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar103._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar103._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar139 = vsubps_avx(auVar206,auVar103);
                local_9c0._0_16_ = ZEXT416((uint)fVar154);
                auVar174 = vdpps_avx(auVar168,_local_990,0x7f);
                fVar194 = auVar99._0_4_ - fVar157 * fVar154;
                fVar157 = auVar174._0_4_ - fVar157 * auVar30._0_4_;
                auVar174 = vrsqrtss_avx(auVar139,auVar139);
                fVar216 = auVar139._0_4_;
                fVar154 = auVar174._0_4_;
                fVar154 = fVar154 * 1.5 + fVar216 * -0.5 * fVar154 * fVar154 * fVar154;
                if (fVar216 < 0.0) {
                  local_a00._0_4_ = fVar194;
                  local_aa0._0_4_ = fVar157;
                  local_a20._0_4_ = fVar154;
                  fVar216 = sqrtf(fVar216);
                  fVar154 = (float)local_a20._0_4_;
                  fVar194 = (float)local_a00._0_4_;
                  fVar157 = (float)local_aa0._0_4_;
                }
                else {
                  auVar174 = vsqrtss_avx(auVar139,auVar139);
                  fVar216 = auVar174._0_4_;
                }
                auVar99 = vpermilps_avx(_local_a40,0xff);
                auVar100 = vshufps_avx(auVar337,auVar337,0xff);
                fVar194 = fVar194 * fVar154 - auVar100._0_4_;
                auVar224._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
                auVar224._8_4_ = auVar30._8_4_ ^ 0x80000000;
                auVar224._12_4_ = auVar30._12_4_ ^ 0x80000000;
                auVar248._0_4_ = -fVar194;
                auVar248._4_4_ = 0x80000000;
                auVar248._8_4_ = 0x80000000;
                auVar248._12_4_ = 0x80000000;
                auVar174 = vinsertps_avx(auVar248,ZEXT416((uint)(fVar157 * fVar154)),0x1c);
                auVar30 = vmovsldup_avx(ZEXT416((uint)(local_9c0._0_4_ * fVar157 * fVar154 -
                                                      auVar30._0_4_ * fVar194)));
                auVar174 = vdivps_avx(auVar174,auVar30);
                auVar139 = vinsertps_avx(local_9c0._0_16_,auVar224,0x10);
                auVar139 = vdivps_avx(auVar139,auVar30);
                auVar30 = vmovsldup_avx(auVar105);
                auVar107 = ZEXT416((uint)(fVar216 - auVar99._0_4_));
                auVar99 = vmovsldup_avx(auVar107);
                auVar170._0_4_ = auVar30._0_4_ * auVar174._0_4_ + auVar99._0_4_ * auVar139._0_4_;
                auVar170._4_4_ = auVar30._4_4_ * auVar174._4_4_ + auVar99._4_4_ * auVar139._4_4_;
                auVar170._8_4_ = auVar30._8_4_ * auVar174._8_4_ + auVar99._8_4_ * auVar139._8_4_;
                auVar170._12_4_ =
                     auVar30._12_4_ * auVar174._12_4_ + auVar99._12_4_ * auVar139._12_4_;
                auVar350 = vsubps_avx(auVar350,auVar170);
                auVar353 = ZEXT1664(auVar350);
                auVar171._8_4_ = 0x7fffffff;
                auVar171._0_8_ = 0x7fffffff7fffffff;
                auVar171._12_4_ = 0x7fffffff;
                auVar105 = vandps_avx(auVar105,auVar171);
                if (auVar105._0_4_ < fVar129) {
                  auVar200._8_4_ = 0x7fffffff;
                  auVar200._0_8_ = 0x7fffffff7fffffff;
                  auVar200._12_4_ = 0x7fffffff;
                  auVar105 = vandps_avx(auVar107,auVar200);
                  if (auVar105._0_4_ <
                      (float)local_820._0_4_ * 1.9073486e-06 + auVar172._0_4_ + fVar129) {
                    fVar129 = auVar350._0_4_ + (float)local_900._0_4_;
                    if ((fVar129 < fVar127) ||
                       (fVar154 = *(float *)(ray + k * 4 + 0x100), fVar154 < fVar129)) break;
                    auVar172 = vmovshdup_avx(auVar350);
                    fVar157 = auVar172._0_4_;
                    if ((fVar157 < 0.0) || (1.0 < fVar157)) break;
                    auVar206 = vrsqrtss_avx(auVar206,auVar206);
                    fVar194 = auVar206._0_4_;
                    pGVar11 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar206 = ZEXT416((uint)(fVar194 * 1.5 +
                                             fVar215 * -0.5 * fVar194 * fVar194 * fVar194));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    local_c80._0_4_ = auVar168._0_4_;
                    local_c80._4_4_ = auVar168._4_4_;
                    fStack_c78 = auVar168._8_4_;
                    fStack_c74 = auVar168._12_4_;
                    auVar201._0_4_ = auVar206._0_4_ * (float)local_c80._0_4_;
                    auVar201._4_4_ = auVar206._4_4_ * (float)local_c80._4_4_;
                    auVar201._8_4_ = auVar206._8_4_ * fStack_c78;
                    auVar201._12_4_ = auVar206._12_4_ * fStack_c74;
                    auVar137._0_4_ = auVar337._0_4_ + auVar100._0_4_ * auVar201._0_4_;
                    auVar137._4_4_ = auVar337._4_4_ + auVar100._4_4_ * auVar201._4_4_;
                    auVar137._8_4_ = auVar337._8_4_ + auVar100._8_4_ * auVar201._8_4_;
                    auVar137._12_4_ = auVar337._12_4_ + auVar100._12_4_ * auVar201._12_4_;
                    auVar206 = vshufps_avx(auVar201,auVar201,0xc9);
                    auVar168 = vshufps_avx(auVar337,auVar337,0xc9);
                    auVar202._0_4_ = auVar168._0_4_ * auVar201._0_4_;
                    auVar202._4_4_ = auVar168._4_4_ * auVar201._4_4_;
                    auVar202._8_4_ = auVar168._8_4_ * auVar201._8_4_;
                    auVar202._12_4_ = auVar168._12_4_ * auVar201._12_4_;
                    auVar225._0_4_ = auVar337._0_4_ * auVar206._0_4_;
                    auVar225._4_4_ = auVar337._4_4_ * auVar206._4_4_;
                    auVar225._8_4_ = auVar337._8_4_ * auVar206._8_4_;
                    auVar225._12_4_ = auVar337._12_4_ * auVar206._12_4_;
                    auVar172 = vsubps_avx(auVar225,auVar202);
                    auVar206 = vshufps_avx(auVar172,auVar172,0xc9);
                    auVar168 = vshufps_avx(auVar137,auVar137,0xc9);
                    auVar226._0_4_ = auVar168._0_4_ * auVar206._0_4_;
                    auVar226._4_4_ = auVar168._4_4_ * auVar206._4_4_;
                    auVar226._8_4_ = auVar168._8_4_ * auVar206._8_4_;
                    auVar226._12_4_ = auVar168._12_4_ * auVar206._12_4_;
                    auVar206 = vshufps_avx(auVar172,auVar172,0xd2);
                    auVar138._0_4_ = auVar137._0_4_ * auVar206._0_4_;
                    auVar138._4_4_ = auVar137._4_4_ * auVar206._4_4_;
                    auVar138._8_4_ = auVar137._8_4_ * auVar206._8_4_;
                    auVar138._12_4_ = auVar137._12_4_ * auVar206._12_4_;
                    auVar206 = vsubps_avx(auVar226,auVar138);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar129;
                      uVar8 = vextractps_avx(auVar206,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                      uVar8 = vextractps_avx(auVar206,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar206._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar157;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_940;
                      *(uint *)(ray + k * 4 + 0x240) = uVar88;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar15 = context->user;
                    auStack_610 = vshufps_avx(auVar350,auVar350,0x55);
                    auStack_670 = vshufps_avx(auVar206,auVar206,0x55);
                    auStack_650 = vshufps_avx(auVar206,auVar206,0xaa);
                    auStack_630 = vshufps_avx(auVar206,auVar206,0);
                    local_680 = (RTCHitN  [16])auStack_670;
                    local_660 = auStack_650;
                    local_640 = auStack_630;
                    local_620 = auStack_610;
                    local_600 = ZEXT832(0) << 0x20;
                    local_5e0 = local_520._0_8_;
                    uStack_5d8 = local_520._8_8_;
                    uStack_5d0 = local_520._16_8_;
                    uStack_5c8 = local_520._24_8_;
                    local_5c0 = local_500._0_8_;
                    uStack_5b8 = local_500._8_8_;
                    uStack_5b0 = local_500._16_8_;
                    uStack_5a8 = local_500._24_8_;
                    *(undefined1 (*) [8])(local_a68 + 8) = local_a60;
                    *(undefined8 *)(local_a68 + 10) = uStack_a58;
                    *(undefined8 *)(local_a68 + 0xc) = uStack_a50;
                    *(undefined8 *)(local_a68 + 0xe) = uStack_a48;
                    *(undefined1 (*) [8])local_a68 = local_a60;
                    *(undefined8 *)(local_a68 + 2) = uStack_a58;
                    *(undefined8 *)(local_a68 + 4) = uStack_a50;
                    *(undefined8 *)(local_a68 + 6) = uStack_a48;
                    local_5a0 = pRVar15->instID[0];
                    uStack_59c = local_5a0;
                    uStack_598 = local_5a0;
                    uStack_594 = local_5a0;
                    uStack_590 = local_5a0;
                    uStack_58c = local_5a0;
                    uStack_588 = local_5a0;
                    uStack_584 = local_5a0;
                    local_580 = pRVar15->instPrimID[0];
                    uStack_57c = local_580;
                    uStack_578 = local_580;
                    uStack_574 = local_580;
                    uStack_570 = local_580;
                    uStack_56c = local_580;
                    uStack_568 = local_580;
                    uStack_564 = local_580;
                    *(float *)(ray + k * 4 + 0x100) = fVar129;
                    local_b40 = *local_a70;
                    local_b30 = *local_a78;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar11->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_680;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar353 = ZEXT1664(auVar350);
                      (*pGVar11->intersectionFilterN)(&local_ad0);
                    }
                    auVar206 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar168 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar180._16_16_ = auVar168;
                    auVar180._0_16_ = auVar206;
                    auVar110 = _local_a60 & ~auVar180;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar353 = ZEXT1664(auVar353._0_16_);
                        (*p_Var16)(&local_ad0);
                      }
                      auVar206 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar168 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar116._16_16_ = auVar168;
                      auVar116._0_16_ = auVar206;
                      auVar110 = _local_a60 & ~auVar116;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0xbf,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar110[0x1f] < '\0') {
                        auVar117._0_4_ = auVar206._0_4_ ^ local_a60._0_4_;
                        auVar117._4_4_ = auVar206._4_4_ ^ local_a60._4_4_;
                        auVar117._8_4_ = auVar206._8_4_ ^ (uint)uStack_a58;
                        auVar117._12_4_ = auVar206._12_4_ ^ uStack_a58._4_4_;
                        auVar117._16_4_ = auVar168._0_4_ ^ (uint)uStack_a50;
                        auVar117._20_4_ = auVar168._4_4_ ^ uStack_a50._4_4_;
                        auVar117._24_4_ = auVar168._8_4_ ^ (uint)uStack_a48;
                        auVar117._28_4_ = auVar168._12_4_ ^ uStack_a48._4_4_;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar117,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar110;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar154;
                    break;
                  }
                }
                lVar97 = lVar97 + -1;
              } while (lVar97 != 0);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar114._4_4_ = uVar8;
              auVar114._0_4_ = uVar8;
              auVar114._8_4_ = uVar8;
              auVar114._12_4_ = uVar8;
              auVar114._16_4_ = uVar8;
              auVar114._20_4_ = uVar8;
              auVar114._24_4_ = uVar8;
              auVar114._28_4_ = uVar8;
              auVar111 = vcmpps_avx(_local_980,auVar114,2);
              auVar110 = vandps_avx(auVar111,local_6c0);
              auVar313 = ZEXT3264(auVar110);
              auVar111 = local_6c0 & auVar111;
              auVar231 = local_860._0_28_;
              local_6c0 = auVar110;
            } while ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar111 >> 0x7f,0) != '\0') ||
                       (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar111 >> 0xbf,0) != '\0') ||
                     (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar111[0x1f] < '\0');
            auVar313 = ZEXT3264(local_320);
            auVar110 = local_7c0;
          }
          auVar150._0_4_ =
               auVar231._0_4_ * (float)local_8a0._0_4_ +
               (float)local_880._0_4_ * (float)local_8c0._0_4_ +
               (float)local_840._0_4_ * (float)local_8e0._0_4_;
          auVar150._4_4_ =
               auVar231._4_4_ * (float)local_8a0._4_4_ +
               (float)local_880._4_4_ * (float)local_8c0._4_4_ +
               (float)local_840._4_4_ * (float)local_8e0._4_4_;
          auVar150._8_4_ =
               auVar231._8_4_ * fStack_898 + fStack_878 * fStack_8b8 + fStack_838 * fStack_8d8;
          auVar150._12_4_ =
               auVar231._12_4_ * fStack_894 + fStack_874 * fStack_8b4 + fStack_834 * fStack_8d4;
          auVar150._16_4_ =
               auVar231._16_4_ * fStack_890 + fStack_870 * fStack_8b0 + fStack_830 * fStack_8d0;
          auVar150._20_4_ =
               auVar231._20_4_ * fStack_88c + fStack_86c * fStack_8ac + fStack_82c * fStack_8cc;
          auVar150._24_4_ =
               auVar231._24_4_ * fStack_888 + fStack_868 * fStack_8a8 + fStack_828 * fStack_8c8;
          auVar150._28_4_ = fStack_864 + fStack_864 + auVar313._28_4_;
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar181._16_4_ = 0x7fffffff;
          auVar181._20_4_ = 0x7fffffff;
          auVar181._24_4_ = 0x7fffffff;
          auVar181._28_4_ = 0x7fffffff;
          auVar111 = vandps_avx(auVar150,auVar181);
          auVar182._8_4_ = 0x3e99999a;
          auVar182._0_8_ = 0x3e99999a3e99999a;
          auVar182._12_4_ = 0x3e99999a;
          auVar182._16_4_ = 0x3e99999a;
          auVar182._20_4_ = 0x3e99999a;
          auVar182._24_4_ = 0x3e99999a;
          auVar182._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar182,1);
          auVar111 = vorps_avx(auVar111,local_740);
          auVar183._0_4_ = (float)local_920._0_4_ + auVar110._0_4_;
          auVar183._4_4_ = (float)local_920._4_4_ + auVar110._4_4_;
          auVar183._8_4_ = fStack_918 + auVar110._8_4_;
          auVar183._12_4_ = fStack_914 + auVar110._12_4_;
          auVar183._16_4_ = fStack_910 + auVar110._16_4_;
          auVar183._20_4_ = fStack_90c + auVar110._20_4_;
          auVar183._24_4_ = fStack_908 + auVar110._24_4_;
          auVar183._28_4_ = fStack_904 + auVar110._28_4_;
          auVar110 = vcmpps_avx(auVar183,auVar114,2);
          _local_8e0 = vandps_avx(auVar110,local_7e0);
          auVar184._8_4_ = 3;
          auVar184._0_8_ = 0x300000003;
          auVar184._12_4_ = 3;
          auVar184._16_4_ = 3;
          auVar184._20_4_ = 3;
          auVar184._24_4_ = 3;
          auVar184._28_4_ = 3;
          auVar214._8_4_ = 2;
          auVar214._0_8_ = 0x200000002;
          auVar214._12_4_ = 2;
          auVar214._16_4_ = 2;
          auVar214._20_4_ = 2;
          auVar214._24_4_ = 2;
          auVar214._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar214,auVar184,auVar111);
          auVar206 = vpcmpgtd_avx(auVar110._16_16_,local_780);
          auVar168 = vpshufd_avx(local_760._0_16_,0);
          auVar168 = vpcmpgtd_avx(auVar110._0_16_,auVar168);
          auVar185._16_16_ = auVar206;
          auVar185._0_16_ = auVar114._0_16_;
          _local_8c0 = vblendps_avx(ZEXT1632(auVar168),auVar185,0xf0);
          auVar110 = vandnps_avx(_local_8c0,_local_8e0);
          auVar111 = _local_8e0 & ~_local_8c0;
          local_6e0 = auVar110;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            local_8a0._4_4_ = (float)local_920._4_4_ + local_320._4_4_;
            local_8a0._0_4_ = (float)local_920._0_4_ + local_320._0_4_;
            fStack_898 = fStack_918 + local_320._8_4_;
            fStack_894 = fStack_914 + local_320._12_4_;
            fStack_890 = fStack_910 + local_320._16_4_;
            fStack_88c = fStack_90c + local_320._20_4_;
            fStack_888 = fStack_908 + local_320._24_4_;
            fStack_884 = fStack_904 + local_320._28_4_;
            _local_980 = local_320;
            do {
              auVar118._8_4_ = 0x7f800000;
              auVar118._0_8_ = 0x7f8000007f800000;
              auVar118._12_4_ = 0x7f800000;
              auVar118._16_4_ = 0x7f800000;
              auVar118._20_4_ = 0x7f800000;
              auVar118._24_4_ = 0x7f800000;
              auVar118._28_4_ = 0x7f800000;
              auVar111 = vblendvps_avx(auVar118,_local_980,auVar110);
              auVar33 = vshufps_avx(auVar111,auVar111,0xb1);
              auVar33 = vminps_avx(auVar111,auVar33);
              auVar31 = vshufpd_avx(auVar33,auVar33,5);
              auVar33 = vminps_avx(auVar33,auVar31);
              auVar31 = vperm2f128_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar33,auVar31);
              auVar33 = vcmpps_avx(auVar111,auVar33,0);
              auVar31 = auVar110 & auVar33;
              auVar111 = auVar110;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar33,auVar110);
              }
              uVar89 = vmovmskps_avx(auVar111);
              uVar92 = 0;
              if (uVar89 != 0) {
                for (; (uVar89 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
                }
              }
              uVar90 = (ulong)uVar92;
              local_6e0 = auVar110;
              *(undefined4 *)(local_6e0 + uVar90 * 4) = 0;
              fVar129 = local_1c0[uVar90];
              uVar92 = *(uint *)(local_300 + uVar90 * 4);
              fVar154 = auVar28._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar154 = sqrtf((float)local_9a0._0_4_);
              }
              auVar168 = vminps_avx(_local_ae0,_local_b00);
              auVar206 = vmaxps_avx(_local_ae0,_local_b00);
              auVar172 = vminps_avx(_local_af0,_local_b10);
              auVar105 = vminps_avx(auVar168,auVar172);
              auVar168 = vmaxps_avx(_local_af0,_local_b10);
              auVar172 = vmaxps_avx(auVar206,auVar168);
              auVar203._8_4_ = 0x7fffffff;
              auVar203._0_8_ = 0x7fffffff7fffffff;
              auVar203._12_4_ = 0x7fffffff;
              auVar206 = vandps_avx(auVar105,auVar203);
              auVar168 = vandps_avx(auVar172,auVar203);
              auVar206 = vmaxps_avx(auVar206,auVar168);
              auVar168 = vmovshdup_avx(auVar206);
              auVar168 = vmaxss_avx(auVar168,auVar206);
              auVar206 = vshufpd_avx(auVar206,auVar206,1);
              auVar206 = vmaxss_avx(auVar206,auVar168);
              local_960 = auVar206._0_4_ * 1.9073486e-06;
              local_9c0._0_4_ = fVar154 * 1.9073486e-06;
              local_820._0_16_ = vshufps_avx(auVar172,auVar172,0xff);
              auVar206 = vinsertps_avx(ZEXT416(uVar92),ZEXT416((uint)fVar129),0x10);
              auVar353 = ZEXT1664(auVar206);
              lVar97 = 5;
              do {
                auVar350 = auVar353._0_16_;
                auVar206 = vshufps_avx(auVar350,auVar350,0);
                auVar104._0_4_ = auVar206._0_4_ * (float)local_990._0_4_ + 0.0;
                auVar104._4_4_ = auVar206._4_4_ * (float)local_990._4_4_ + 0.0;
                auVar104._8_4_ = auVar206._8_4_ * fStack_988 + 0.0;
                auVar104._12_4_ = auVar206._12_4_ * fStack_984 + 0.0;
                auVar206 = vmovshdup_avx(auVar350);
                fVar216 = auVar206._0_4_;
                fVar194 = 1.0 - fVar216;
                fVar154 = fVar216 * fVar216;
                fVar157 = fVar216 * 3.0;
                fVar129 = fVar157 + -5.0;
                auVar206 = ZEXT416((uint)(fVar216 * fVar216 * -fVar194 * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar168 = ZEXT416((uint)((fVar194 * fVar194 * (fVar194 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar168 = vshufps_avx(auVar168,auVar168,0);
                auVar172 = ZEXT416((uint)((fVar154 * fVar129 + 2.0) * 0.5));
                auVar172 = vshufps_avx(auVar172,auVar172,0);
                auVar105 = ZEXT416((uint)(fVar194 * fVar194 * -fVar216 * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar173._0_4_ =
                     auVar105._0_4_ * (float)local_ae0._0_4_ +
                     auVar172._0_4_ * (float)local_b00._0_4_ +
                     auVar168._0_4_ * (float)local_af0._0_4_ +
                     auVar206._0_4_ * (float)local_b10._0_4_;
                auVar173._4_4_ =
                     auVar105._4_4_ * (float)local_ae0._4_4_ +
                     auVar172._4_4_ * (float)local_b00._4_4_ +
                     auVar168._4_4_ * (float)local_af0._4_4_ +
                     auVar206._4_4_ * (float)local_b10._4_4_;
                auVar173._8_4_ =
                     auVar105._8_4_ * fStack_ad8 +
                     auVar172._8_4_ * fStack_af8 +
                     auVar168._8_4_ * fStack_ae8 + auVar206._8_4_ * fStack_b08;
                auVar173._12_4_ =
                     auVar105._12_4_ * fStack_ad4 +
                     auVar172._12_4_ * fStack_af4 +
                     auVar168._12_4_ * fStack_ae4 + auVar206._12_4_ * fStack_b04;
                _local_a40 = auVar173;
                auVar168 = vsubps_avx(auVar104,auVar173);
                auVar206 = vdpps_avx(auVar168,auVar168,0x7f);
                fVar215 = auVar206._0_4_;
                if (fVar215 < 0.0) {
                  local_9e0._0_4_ = fVar154;
                  local_a00._0_4_ = fVar157;
                  local_aa0._0_4_ = fVar216 * 9.0;
                  local_a20._0_4_ = fVar129;
                  local_800._0_4_ = fVar194 * -2.0;
                  fVar217 = sqrtf(fVar215);
                  fVar238 = (float)local_aa0._0_4_;
                  fVar219 = (float)local_800._0_4_;
                  fVar154 = (float)local_9e0._0_4_;
                  fVar237 = (float)local_a00._0_4_;
                  fVar129 = (float)local_a20._0_4_;
                }
                else {
                  auVar172 = vsqrtss_avx(auVar206,auVar206);
                  fVar217 = auVar172._0_4_;
                  fVar238 = fVar216 * 9.0;
                  fVar219 = fVar194 * -2.0;
                  fVar237 = fVar157;
                }
                auVar172 = ZEXT416((uint)((fVar154 + fVar216 * fVar219) * 0.5));
                auVar172 = vshufps_avx(auVar172,auVar172,0);
                auVar105 = ZEXT416((uint)(((fVar194 + fVar194) * (fVar237 + 2.0) +
                                          fVar194 * fVar194 * -3.0) * 0.5));
                auVar105 = vshufps_avx(auVar105,auVar105,0);
                auVar174 = ZEXT416((uint)((fVar129 * (fVar216 + fVar216) + fVar216 * fVar237) * 0.5)
                                  );
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar139 = ZEXT416((uint)((fVar216 * (fVar194 + fVar194) - fVar194 * fVar194) * 0.5)
                                  );
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar338._0_4_ =
                     (float)local_ae0._0_4_ * auVar139._0_4_ +
                     (float)local_b00._0_4_ * auVar174._0_4_ +
                     (float)local_b10._0_4_ * auVar172._0_4_ +
                     (float)local_af0._0_4_ * auVar105._0_4_;
                auVar338._4_4_ =
                     (float)local_ae0._4_4_ * auVar139._4_4_ +
                     (float)local_b00._4_4_ * auVar174._4_4_ +
                     (float)local_b10._4_4_ * auVar172._4_4_ +
                     (float)local_af0._4_4_ * auVar105._4_4_;
                auVar338._8_4_ =
                     fStack_ad8 * auVar139._8_4_ +
                     fStack_af8 * auVar174._8_4_ +
                     fStack_b08 * auVar172._8_4_ + fStack_ae8 * auVar105._8_4_;
                auVar338._12_4_ =
                     fStack_ad4 * auVar139._12_4_ +
                     fStack_af4 * auVar174._12_4_ +
                     fStack_b04 * auVar172._12_4_ + fStack_ae4 * auVar105._12_4_;
                auVar139 = vpermilps_avx(ZEXT416((uint)(fVar157 + -1.0)),0);
                auVar30 = vpermilps_avx(ZEXT416((uint)(fVar216 * -9.0 + 4.0)),0);
                auVar172 = vshufps_avx(ZEXT416((uint)(fVar238 + -5.0)),
                                       ZEXT416((uint)(fVar238 + -5.0)),0);
                auVar105 = ZEXT416((uint)(fVar216 * -3.0 + 2.0));
                auVar174 = vshufps_avx(auVar105,auVar105,0);
                auVar105 = vdpps_avx(auVar338,auVar338,0x7f);
                auVar140._0_4_ =
                     (float)local_ae0._0_4_ * auVar174._0_4_ +
                     (float)local_b00._0_4_ * auVar172._0_4_ +
                     (float)local_af0._0_4_ * auVar30._0_4_ +
                     (float)local_b10._0_4_ * auVar139._0_4_;
                auVar140._4_4_ =
                     (float)local_ae0._4_4_ * auVar174._4_4_ +
                     (float)local_b00._4_4_ * auVar172._4_4_ +
                     (float)local_af0._4_4_ * auVar30._4_4_ +
                     (float)local_b10._4_4_ * auVar139._4_4_;
                auVar140._8_4_ =
                     fStack_ad8 * auVar174._8_4_ +
                     fStack_af8 * auVar172._8_4_ +
                     fStack_ae8 * auVar30._8_4_ + fStack_b08 * auVar139._8_4_;
                auVar140._12_4_ =
                     fStack_ad4 * auVar174._12_4_ +
                     fStack_af4 * auVar172._12_4_ +
                     fStack_ae4 * auVar30._12_4_ + fStack_b04 * auVar139._12_4_;
                auVar172 = vblendps_avx(auVar105,_DAT_01f7aa10,0xe);
                auVar174 = vrsqrtss_avx(auVar172,auVar172);
                fVar154 = auVar174._0_4_;
                fVar129 = auVar105._0_4_;
                auVar174 = vdpps_avx(auVar338,auVar140,0x7f);
                auVar139 = vshufps_avx(auVar105,auVar105,0);
                auVar141._0_4_ = auVar140._0_4_ * auVar139._0_4_;
                auVar141._4_4_ = auVar140._4_4_ * auVar139._4_4_;
                auVar141._8_4_ = auVar140._8_4_ * auVar139._8_4_;
                auVar141._12_4_ = auVar140._12_4_ * auVar139._12_4_;
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar227._0_4_ = auVar338._0_4_ * auVar174._0_4_;
                auVar227._4_4_ = auVar338._4_4_ * auVar174._4_4_;
                auVar227._8_4_ = auVar338._8_4_ * auVar174._8_4_;
                auVar227._12_4_ = auVar338._12_4_ * auVar174._12_4_;
                auVar30 = vsubps_avx(auVar141,auVar227);
                auVar174 = vrcpss_avx(auVar172,auVar172);
                auVar172 = vmaxss_avx(ZEXT416((uint)local_960),
                                      ZEXT416((uint)(auVar353._0_4_ * (float)local_9c0._0_4_)));
                auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - fVar129 * auVar174._0_4_)));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                uVar90 = CONCAT44(auVar338._4_4_,auVar338._0_4_);
                auVar249._0_8_ = uVar90 ^ 0x8000000080000000;
                auVar249._8_4_ = -auVar338._8_4_;
                auVar249._12_4_ = -auVar338._12_4_;
                auVar139 = ZEXT416((uint)(fVar154 * 1.5 +
                                         fVar129 * -0.5 * fVar154 * fVar154 * fVar154));
                auVar139 = vshufps_avx(auVar139,auVar139,0);
                auVar204._0_4_ = auVar139._0_4_ * auVar30._0_4_ * auVar174._0_4_;
                auVar204._4_4_ = auVar139._4_4_ * auVar30._4_4_ * auVar174._4_4_;
                auVar204._8_4_ = auVar139._8_4_ * auVar30._8_4_ * auVar174._8_4_;
                auVar204._12_4_ = auVar139._12_4_ * auVar30._12_4_ * auVar174._12_4_;
                auVar265._0_4_ = auVar338._0_4_ * auVar139._0_4_;
                auVar265._4_4_ = auVar338._4_4_ * auVar139._4_4_;
                auVar265._8_4_ = auVar338._8_4_ * auVar139._8_4_;
                auVar265._12_4_ = auVar338._12_4_ * auVar139._12_4_;
                if (fVar129 < 0.0) {
                  local_9e0._0_16_ = auVar265;
                  fVar129 = sqrtf(fVar129);
                  auVar265 = local_9e0._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                  fVar129 = auVar105._0_4_;
                }
                auVar105 = vdpps_avx(auVar168,auVar265,0x7f);
                fVar129 = (local_960 / fVar129) * (fVar217 + 1.0) +
                          auVar172._0_4_ + fVar217 * local_960;
                auVar174 = vdpps_avx(auVar249,auVar265,0x7f);
                auVar139 = vdpps_avx(auVar168,auVar204,0x7f);
                auVar30 = vdpps_avx(_local_990,auVar265,0x7f);
                auVar99 = vdpps_avx(auVar168,auVar249,0x7f);
                fVar154 = auVar174._0_4_ + auVar139._0_4_;
                fVar157 = auVar105._0_4_;
                auVar106._0_4_ = fVar157 * fVar157;
                auVar106._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar106._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar106._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar139 = vsubps_avx(auVar206,auVar106);
                auVar174 = vdpps_avx(auVar168,_local_990,0x7f);
                fVar194 = auVar99._0_4_ - fVar157 * fVar154;
                fVar216 = auVar174._0_4_ - fVar157 * auVar30._0_4_;
                auVar174 = vrsqrtss_avx(auVar139,auVar139);
                fVar217 = auVar139._0_4_;
                fVar157 = auVar174._0_4_;
                fVar157 = fVar157 * 1.5 + fVar217 * -0.5 * fVar157 * fVar157 * fVar157;
                if (fVar217 < 0.0) {
                  local_9e0._0_16_ = auVar105;
                  local_a00._0_4_ = fVar194;
                  local_aa0._0_4_ = fVar216;
                  local_a20._0_4_ = fVar157;
                  fVar217 = sqrtf(fVar217);
                  fVar157 = (float)local_a20._0_4_;
                  fVar194 = (float)local_a00._0_4_;
                  fVar216 = (float)local_aa0._0_4_;
                  auVar105 = local_9e0._0_16_;
                }
                else {
                  auVar174 = vsqrtss_avx(auVar139,auVar139);
                  fVar217 = auVar174._0_4_;
                }
                auVar99 = vpermilps_avx(_local_a40,0xff);
                auVar100 = vshufps_avx(auVar338,auVar338,0xff);
                fVar194 = fVar194 * fVar157 - auVar100._0_4_;
                auVar228._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
                auVar228._8_4_ = auVar30._8_4_ ^ 0x80000000;
                auVar228._12_4_ = auVar30._12_4_ ^ 0x80000000;
                auVar250._0_4_ = -fVar194;
                auVar250._4_4_ = 0x80000000;
                auVar250._8_4_ = 0x80000000;
                auVar250._12_4_ = 0x80000000;
                auVar174 = vinsertps_avx(auVar250,ZEXT416((uint)(fVar216 * fVar157)),0x1c);
                auVar30 = vmovsldup_avx(ZEXT416((uint)(fVar154 * fVar216 * fVar157 -
                                                      auVar30._0_4_ * fVar194)));
                auVar174 = vdivps_avx(auVar174,auVar30);
                auVar139 = vinsertps_avx(ZEXT416((uint)fVar154),auVar228,0x10);
                auVar139 = vdivps_avx(auVar139,auVar30);
                auVar30 = vmovsldup_avx(auVar105);
                auVar107 = ZEXT416((uint)(fVar217 - auVar99._0_4_));
                auVar99 = vmovsldup_avx(auVar107);
                auVar175._0_4_ = auVar30._0_4_ * auVar174._0_4_ + auVar99._0_4_ * auVar139._0_4_;
                auVar175._4_4_ = auVar30._4_4_ * auVar174._4_4_ + auVar99._4_4_ * auVar139._4_4_;
                auVar175._8_4_ = auVar30._8_4_ * auVar174._8_4_ + auVar99._8_4_ * auVar139._8_4_;
                auVar175._12_4_ =
                     auVar30._12_4_ * auVar174._12_4_ + auVar99._12_4_ * auVar139._12_4_;
                auVar350 = vsubps_avx(auVar350,auVar175);
                auVar353 = ZEXT1664(auVar350);
                auVar176._8_4_ = 0x7fffffff;
                auVar176._0_8_ = 0x7fffffff7fffffff;
                auVar176._12_4_ = 0x7fffffff;
                auVar105 = vandps_avx(auVar105,auVar176);
                if (auVar105._0_4_ < fVar129) {
                  auVar205._8_4_ = 0x7fffffff;
                  auVar205._0_8_ = 0x7fffffff7fffffff;
                  auVar205._12_4_ = 0x7fffffff;
                  auVar105 = vandps_avx(auVar107,auVar205);
                  if (auVar105._0_4_ <
                      (float)local_820._0_4_ * 1.9073486e-06 + auVar172._0_4_ + fVar129) {
                    fVar129 = auVar350._0_4_ + (float)local_900._0_4_;
                    if ((fVar129 < fVar127) ||
                       (fVar154 = *(float *)(ray + k * 4 + 0x100), fVar154 < fVar129)) break;
                    auVar172 = vmovshdup_avx(auVar350);
                    fVar157 = auVar172._0_4_;
                    if ((fVar157 < 0.0) || (1.0 < fVar157)) break;
                    auVar206 = vrsqrtss_avx(auVar206,auVar206);
                    fVar194 = auVar206._0_4_;
                    pGVar11 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar206 = ZEXT416((uint)(fVar194 * 1.5 +
                                             fVar215 * -0.5 * fVar194 * fVar194 * fVar194));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    local_c80._0_4_ = auVar168._0_4_;
                    local_c80._4_4_ = auVar168._4_4_;
                    fStack_c78 = auVar168._8_4_;
                    fStack_c74 = auVar168._12_4_;
                    auVar207._0_4_ = auVar206._0_4_ * (float)local_c80._0_4_;
                    auVar207._4_4_ = auVar206._4_4_ * (float)local_c80._4_4_;
                    auVar207._8_4_ = auVar206._8_4_ * fStack_c78;
                    auVar207._12_4_ = auVar206._12_4_ * fStack_c74;
                    auVar142._0_4_ = auVar338._0_4_ + auVar100._0_4_ * auVar207._0_4_;
                    auVar142._4_4_ = auVar338._4_4_ + auVar100._4_4_ * auVar207._4_4_;
                    auVar142._8_4_ = auVar338._8_4_ + auVar100._8_4_ * auVar207._8_4_;
                    auVar142._12_4_ = auVar338._12_4_ + auVar100._12_4_ * auVar207._12_4_;
                    auVar206 = vshufps_avx(auVar207,auVar207,0xc9);
                    auVar168 = vshufps_avx(auVar338,auVar338,0xc9);
                    auVar208._0_4_ = auVar168._0_4_ * auVar207._0_4_;
                    auVar208._4_4_ = auVar168._4_4_ * auVar207._4_4_;
                    auVar208._8_4_ = auVar168._8_4_ * auVar207._8_4_;
                    auVar208._12_4_ = auVar168._12_4_ * auVar207._12_4_;
                    auVar229._0_4_ = auVar338._0_4_ * auVar206._0_4_;
                    auVar229._4_4_ = auVar338._4_4_ * auVar206._4_4_;
                    auVar229._8_4_ = auVar338._8_4_ * auVar206._8_4_;
                    auVar229._12_4_ = auVar338._12_4_ * auVar206._12_4_;
                    auVar172 = vsubps_avx(auVar229,auVar208);
                    auVar206 = vshufps_avx(auVar172,auVar172,0xc9);
                    auVar168 = vshufps_avx(auVar142,auVar142,0xc9);
                    auVar230._0_4_ = auVar168._0_4_ * auVar206._0_4_;
                    auVar230._4_4_ = auVar168._4_4_ * auVar206._4_4_;
                    auVar230._8_4_ = auVar168._8_4_ * auVar206._8_4_;
                    auVar230._12_4_ = auVar168._12_4_ * auVar206._12_4_;
                    auVar206 = vshufps_avx(auVar172,auVar172,0xd2);
                    auVar143._0_4_ = auVar142._0_4_ * auVar206._0_4_;
                    auVar143._4_4_ = auVar142._4_4_ * auVar206._4_4_;
                    auVar143._8_4_ = auVar142._8_4_ * auVar206._8_4_;
                    auVar143._12_4_ = auVar142._12_4_ * auVar206._12_4_;
                    auVar206 = vsubps_avx(auVar230,auVar143);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar129;
                      uVar8 = vextractps_avx(auVar206,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                      uVar8 = vextractps_avx(auVar206,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar206._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar157;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_940;
                      *(uint *)(ray + k * 4 + 0x240) = uVar88;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar15 = context->user;
                    auStack_610 = vshufps_avx(auVar350,auVar350,0x55);
                    auStack_670 = vshufps_avx(auVar206,auVar206,0x55);
                    auStack_650 = vshufps_avx(auVar206,auVar206,0xaa);
                    auStack_630 = vshufps_avx(auVar206,auVar206,0);
                    local_680 = (RTCHitN  [16])auStack_670;
                    local_660 = auStack_650;
                    local_640 = auStack_630;
                    local_620 = auStack_610;
                    local_600 = ZEXT832(0) << 0x20;
                    local_5e0 = local_520._0_8_;
                    uStack_5d8 = local_520._8_8_;
                    uStack_5d0 = local_520._16_8_;
                    uStack_5c8 = local_520._24_8_;
                    local_5c0 = local_500._0_8_;
                    uStack_5b8 = local_500._8_8_;
                    uStack_5b0 = local_500._16_8_;
                    uStack_5a8 = local_500._24_8_;
                    *(undefined1 (*) [8])(local_a68 + 8) = local_a60;
                    *(undefined8 *)(local_a68 + 10) = uStack_a58;
                    *(undefined8 *)(local_a68 + 0xc) = uStack_a50;
                    *(undefined8 *)(local_a68 + 0xe) = uStack_a48;
                    *(undefined1 (*) [8])local_a68 = local_a60;
                    *(undefined8 *)(local_a68 + 2) = uStack_a58;
                    *(undefined8 *)(local_a68 + 4) = uStack_a50;
                    *(undefined8 *)(local_a68 + 6) = uStack_a48;
                    local_5a0 = pRVar15->instID[0];
                    uStack_59c = local_5a0;
                    uStack_598 = local_5a0;
                    uStack_594 = local_5a0;
                    uStack_590 = local_5a0;
                    uStack_58c = local_5a0;
                    uStack_588 = local_5a0;
                    uStack_584 = local_5a0;
                    local_580 = pRVar15->instPrimID[0];
                    uStack_57c = local_580;
                    uStack_578 = local_580;
                    uStack_574 = local_580;
                    uStack_570 = local_580;
                    uStack_56c = local_580;
                    uStack_568 = local_580;
                    uStack_564 = local_580;
                    *(float *)(ray + k * 4 + 0x100) = fVar129;
                    local_b40 = *local_a70;
                    local_b30 = *local_a78;
                    local_ad0.valid = (int *)local_b40;
                    local_ad0.geometryUserPtr = pGVar11->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_680;
                    local_ad0.N = 8;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar353 = ZEXT1664(auVar350);
                      (*pGVar11->intersectionFilterN)(&local_ad0);
                    }
                    auVar206 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar168 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar186._16_16_ = auVar168;
                    auVar186._0_16_ = auVar206;
                    auVar110 = _local_a60 & ~auVar186;
                    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0x7f,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar110 >> 0xbf,0) != '\0') ||
                        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar110[0x1f] < '\0') {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar353 = ZEXT1664(auVar353._0_16_);
                        (*p_Var16)(&local_ad0);
                      }
                      auVar206 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar168 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar119._16_16_ = auVar168;
                      auVar119._0_16_ = auVar206;
                      auVar110 = _local_a60 & ~auVar119;
                      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar110 >> 0xbf,0) != '\0') ||
                          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar110[0x1f] < '\0') {
                        auVar120._0_4_ = auVar206._0_4_ ^ local_a60._0_4_;
                        auVar120._4_4_ = auVar206._4_4_ ^ local_a60._4_4_;
                        auVar120._8_4_ = auVar206._8_4_ ^ (uint)uStack_a58;
                        auVar120._12_4_ = auVar206._12_4_ ^ uStack_a58._4_4_;
                        auVar120._16_4_ = auVar168._0_4_ ^ (uint)uStack_a50;
                        auVar120._20_4_ = auVar168._4_4_ ^ uStack_a50._4_4_;
                        auVar120._24_4_ = auVar168._8_4_ ^ (uint)uStack_a48;
                        auVar120._28_4_ = auVar168._12_4_ ^ uStack_a48._4_4_;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])local_ad0.hit);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x20));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x40));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x60));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x80));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar110;
                        auVar110 = vmaskmovps_avx(auVar120,*(undefined1 (*) [32])
                                                            (local_ad0.hit + 0x100));
                        *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar110;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar154;
                    break;
                  }
                }
                lVar97 = lVar97 + -1;
              } while (lVar97 != 0);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar114._4_4_ = uVar8;
              auVar114._0_4_ = uVar8;
              auVar114._8_4_ = uVar8;
              auVar114._12_4_ = uVar8;
              auVar114._16_4_ = uVar8;
              auVar114._20_4_ = uVar8;
              auVar114._24_4_ = uVar8;
              auVar114._28_4_ = uVar8;
              auVar111 = vcmpps_avx(_local_8a0,auVar114,2);
              auVar110 = vandps_avx(auVar111,local_6e0);
              local_6e0 = local_6e0 & auVar111;
            } while ((((((((local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_6e0 >> 0x7f,0) != '\0') ||
                       (local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_6e0 >> 0xbf,0) != '\0') ||
                     (local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_6e0[0x1f] < '\0');
            local_6e0 = auVar110;
          }
          auVar313 = ZEXT3264(local_320);
          auVar110 = vandps_avx(local_720,local_700);
          auVar111 = vandps_avx(_local_8e0,_local_8c0);
          auVar235._0_4_ = (float)local_920._0_4_ + local_360._0_4_;
          auVar235._4_4_ = (float)local_920._4_4_ + local_360._4_4_;
          auVar235._8_4_ = fStack_918 + local_360._8_4_;
          auVar235._12_4_ = fStack_914 + local_360._12_4_;
          auVar235._16_4_ = fStack_910 + local_360._16_4_;
          auVar235._20_4_ = fStack_90c + local_360._20_4_;
          auVar235._24_4_ = fStack_908 + local_360._24_4_;
          auVar235._28_4_ = fStack_904 + local_360._28_4_;
          auVar33 = vcmpps_avx(auVar235,auVar114,2);
          auVar110 = vandps_avx(auVar33,auVar110);
          auVar236._0_4_ = local_320._0_4_ + (float)local_920._0_4_;
          auVar236._4_4_ = local_320._4_4_ + (float)local_920._4_4_;
          auVar236._8_4_ = local_320._8_4_ + fStack_918;
          auVar236._12_4_ = local_320._12_4_ + fStack_914;
          auVar236._16_4_ = local_320._16_4_ + fStack_910;
          auVar236._20_4_ = local_320._20_4_ + fStack_90c;
          auVar236._24_4_ = local_320._24_4_ + fStack_908;
          auVar236._28_4_ = local_320._28_4_ + fStack_904;
          auVar33 = vcmpps_avx(auVar236,auVar114,2);
          auVar111 = vandps_avx(auVar33,auVar111);
          auVar111 = vorps_avx(auVar110,auVar111);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar95 * 0x60) = auVar111;
            auVar110 = vblendvps_avx(local_320,_local_360,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar95 * 0x60) = auVar110;
            uVar9 = vmovlps_avx(local_690);
            (&uStack_140)[uVar95 * 0xc] = uVar9;
            aiStack_138[uVar95 * 0x18] = local_cc4 + 1;
            iVar94 = iVar94 + 1;
          }
        }
      }
    }
    if (iVar94 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar121._4_4_ = uVar8;
    auVar121._0_4_ = uVar8;
    auVar121._8_4_ = uVar8;
    auVar121._12_4_ = uVar8;
    auVar121._16_4_ = uVar8;
    auVar121._20_4_ = uVar8;
    auVar121._24_4_ = uVar8;
    auVar121._28_4_ = uVar8;
    uVar92 = -iVar94;
    pauVar91 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar94 - 1) * 0x60);
    while( true ) {
      auVar110 = pauVar91[1];
      auVar151._0_4_ = (float)local_920._0_4_ + auVar110._0_4_;
      auVar151._4_4_ = (float)local_920._4_4_ + auVar110._4_4_;
      auVar151._8_4_ = fStack_918 + auVar110._8_4_;
      auVar151._12_4_ = fStack_914 + auVar110._12_4_;
      auVar151._16_4_ = fStack_910 + auVar110._16_4_;
      auVar151._20_4_ = fStack_90c + auVar110._20_4_;
      auVar151._24_4_ = fStack_908 + auVar110._24_4_;
      auVar151._28_4_ = fStack_904 + auVar110._28_4_;
      auVar33 = vcmpps_avx(auVar151,auVar121,2);
      auVar111 = vandps_avx(auVar33,*pauVar91);
      _local_680 = auVar111;
      auVar33 = *pauVar91 & auVar33;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0x7f,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0xbf,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar33[0x1f] < '\0') break;
      pauVar91 = pauVar91 + -3;
      uVar92 = uVar92 + 1;
      if (uVar92 == 0) goto LAB_00f9ee36;
    }
    auVar122._8_4_ = 0x7f800000;
    auVar122._0_8_ = 0x7f8000007f800000;
    auVar122._12_4_ = 0x7f800000;
    auVar122._16_4_ = 0x7f800000;
    auVar122._20_4_ = 0x7f800000;
    auVar122._24_4_ = 0x7f800000;
    auVar122._28_4_ = 0x7f800000;
    auVar110 = vblendvps_avx(auVar122,auVar110,auVar111);
    auVar33 = vshufps_avx(auVar110,auVar110,0xb1);
    auVar33 = vminps_avx(auVar110,auVar33);
    auVar31 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vminps_avx(auVar33,auVar31);
    auVar31 = vperm2f128_avx(auVar33,auVar33,1);
    auVar33 = vminps_avx(auVar33,auVar31);
    auVar110 = vcmpps_avx(auVar110,auVar33,0);
    auVar33 = auVar111 & auVar110;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar33 >> 0x7f,0) != '\0') ||
          (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar33 >> 0xbf,0) != '\0') ||
        (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar33[0x1f] < '\0')
    {
      auVar111 = vandps_avx(auVar110,auVar111);
    }
    auVar108._8_8_ = 0;
    auVar108._0_8_ = *(ulong *)pauVar91[2];
    local_cc4 = *(uint *)(pauVar91[2] + 8);
    uVar93 = vmovmskps_avx(auVar111);
    uVar89 = 0;
    if (uVar93 != 0) {
      for (; (uVar93 >> uVar89 & 1) == 0; uVar89 = uVar89 + 1) {
      }
    }
    *(undefined4 *)(local_680 + (ulong)uVar89 * 4) = 0;
    *pauVar91 = _local_680;
    uVar93 = ~uVar92;
    if ((((((((_local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_680 >> 0x7f,0) != '\0') ||
          (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_680 >> 0xbf,0) != '\0') ||
        (_local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_680[0x1f] < '\0') {
      uVar93 = -uVar92;
    }
    uVar95 = (ulong)uVar93;
    auVar206 = vshufps_avx(auVar108,auVar108,0);
    auVar168 = vshufps_avx(auVar108,auVar108,0x55);
    auVar168 = vsubps_avx(auVar168,auVar206);
    local_360._4_4_ = auVar206._4_4_ + auVar168._4_4_ * 0.14285715;
    local_360._0_4_ = auVar206._0_4_ + auVar168._0_4_ * 0.0;
    fStack_358 = auVar206._8_4_ + auVar168._8_4_ * 0.2857143;
    fStack_354 = auVar206._12_4_ + auVar168._12_4_ * 0.42857146;
    fStack_350 = auVar206._0_4_ + auVar168._0_4_ * 0.5714286;
    fStack_34c = auVar206._4_4_ + auVar168._4_4_ * 0.71428573;
    fStack_348 = auVar206._8_4_ + auVar168._8_4_ * 0.8571429;
    fStack_344 = auVar206._12_4_ + auVar168._12_4_;
    local_690._8_8_ = 0;
    local_690._0_8_ = *(ulong *)(local_360 + (ulong)uVar89 * 4);
  } while( true );
LAB_00f9ee36:
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar109._4_4_ = uVar8;
  auVar109._0_4_ = uVar8;
  auVar109._8_4_ = uVar8;
  auVar109._12_4_ = uVar8;
  auVar134 = vcmpps_avx(local_6a0,auVar109,2);
  uVar88 = vmovmskps_avx(auVar134);
  uVar87 = uVar87 - 1 & uVar87 & uVar88;
  if (uVar87 == 0) {
    return;
  }
  goto LAB_00f9be02;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }